

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx2::CurveNvIntersector1<8>::
     intersect_t<embree::avx2::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Primitive PVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  int iVar19;
  ulong uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  long lVar69;
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 (*pauVar87) [32];
  uint uVar88;
  uint uVar89;
  uint uVar90;
  long lVar91;
  ulong uVar92;
  ulong uVar93;
  int iVar94;
  ulong uVar95;
  float fVar96;
  undefined4 uVar97;
  undefined8 uVar98;
  float fVar123;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar122;
  float fVar124;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar111 [16];
  undefined1 auVar121 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [64];
  float fVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar162;
  float fVar163;
  undefined1 auVar151 [32];
  float fVar164;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar186;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar195 [32];
  float fVar203;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined4 uVar207;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar221 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar237 [16];
  float fVar236;
  float fVar242;
  float fVar243;
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar238 [32];
  float fVar244;
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [64];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar251;
  undefined1 in_ZMM10 [64];
  undefined1 auVar250 [64];
  undefined1 auVar252 [32];
  undefined1 auVar253 [64];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar254;
  undefined1 auVar259 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  float fVar268;
  float fVar271;
  float fVar272;
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_aec;
  RTCFilterFunctionNArguments local_ab8;
  int local_a84;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 auStack_9d0 [16];
  undefined8 local_9b0;
  float local_9a8;
  float local_9a4;
  undefined4 local_9a0;
  uint local_99c;
  uint local_998;
  uint local_994;
  uint local_990;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  undefined1 auStack_8f0 [16];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [28];
  uint uStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [16];
  Primitive *local_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  undefined1 auStack_710 [8];
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  undefined4 uStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  uint local_600;
  uint uStack_5fc;
  uint uStack_5f8;
  uint uStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  uint uStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined4 local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar9 = prim[1];
  uVar95 = (ulong)(byte)PVar9;
  lVar69 = uVar95 * 0x19;
  fVar186 = *(float *)(prim + lVar69 + 0x12);
  auVar107 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar69 + 6));
  auVar99._0_4_ = fVar186 * auVar107._0_4_;
  auVar99._4_4_ = fVar186 * auVar107._4_4_;
  auVar99._8_4_ = fVar186 * auVar107._8_4_;
  auVar99._12_4_ = fVar186 * auVar107._12_4_;
  auVar218._0_4_ = fVar186 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar218._4_4_ = fVar186 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar218._8_4_ = fVar186 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar218._12_4_ = fVar186 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar95 * 4 + 6);
  auVar112 = vpmovsxbd_avx2(auVar107);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar95 * 5 + 6);
  auVar113 = vpmovsxbd_avx2(auVar102);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar95 * 6 + 6);
  auVar13 = vpmovsxbd_avx2(auVar3);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar95 * 0xb + 6);
  auVar221 = vpmovsxbd_avx2(auVar4);
  auVar221 = vcvtdq2ps_avx(auVar221);
  auVar237._8_8_ = 0;
  auVar237._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6);
  auVar14 = vpmovsxbd_avx2(auVar237);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (uint)(byte)PVar9 * 0xc + uVar95 + 6);
  auVar15 = vpmovsxbd_avx2(auVar5);
  auVar15 = vcvtdq2ps_avx(auVar15);
  uVar93 = (ulong)(uint)((int)(uVar95 * 9) * 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar93 + 6);
  auVar16 = vpmovsxbd_avx2(auVar6);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar93 + uVar95 + 6);
  auVar17 = vpmovsxbd_avx2(auVar7);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar253 = ZEXT3264(auVar17);
  uVar93 = (ulong)(uint)((int)(uVar95 * 5) << 2);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar93 + 6);
  auVar18 = vpmovsxbd_avx2(auVar8);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar265._4_4_ = auVar218._0_4_;
  auVar265._0_4_ = auVar218._0_4_;
  auVar265._8_4_ = auVar218._0_4_;
  auVar265._12_4_ = auVar218._0_4_;
  auVar265._16_4_ = auVar218._0_4_;
  auVar265._20_4_ = auVar218._0_4_;
  auVar265._24_4_ = auVar218._0_4_;
  auVar265._28_4_ = auVar218._0_4_;
  auVar107 = vmovshdup_avx(auVar218);
  uVar98 = auVar107._0_8_;
  auVar269._8_8_ = uVar98;
  auVar269._0_8_ = uVar98;
  auVar269._16_8_ = uVar98;
  auVar269._24_8_ = uVar98;
  auVar107 = vshufps_avx(auVar218,auVar218,0xaa);
  fVar186 = auVar107._0_4_;
  auVar260._0_4_ = fVar186 * auVar13._0_4_;
  fVar200 = auVar107._4_4_;
  auVar260._4_4_ = fVar200 * auVar13._4_4_;
  auVar260._8_4_ = fVar186 * auVar13._8_4_;
  auVar260._12_4_ = fVar200 * auVar13._12_4_;
  auVar260._16_4_ = fVar186 * auVar13._16_4_;
  auVar260._20_4_ = fVar200 * auVar13._20_4_;
  auVar260._28_36_ = in_ZMM12._28_36_;
  auVar260._24_4_ = fVar186 * auVar13._24_4_;
  auVar250._0_4_ = auVar15._0_4_ * fVar186;
  auVar250._4_4_ = auVar15._4_4_ * fVar200;
  auVar250._8_4_ = auVar15._8_4_ * fVar186;
  auVar250._12_4_ = auVar15._12_4_ * fVar200;
  auVar250._16_4_ = auVar15._16_4_ * fVar186;
  auVar250._20_4_ = auVar15._20_4_ * fVar200;
  auVar250._28_36_ = in_ZMM10._28_36_;
  auVar250._24_4_ = auVar15._24_4_ * fVar186;
  auVar238._0_4_ = auVar18._0_4_ * fVar186;
  auVar238._4_4_ = auVar18._4_4_ * fVar200;
  auVar238._8_4_ = auVar18._8_4_ * fVar186;
  auVar238._12_4_ = auVar18._12_4_ * fVar200;
  auVar238._16_4_ = auVar18._16_4_ * fVar186;
  auVar238._20_4_ = auVar18._20_4_ * fVar200;
  auVar238._24_4_ = auVar18._24_4_ * fVar186;
  auVar238._28_4_ = 0;
  auVar107 = vfmadd231ps_fma(auVar260._0_32_,auVar269,auVar113);
  auVar102 = vfmadd231ps_fma(auVar250._0_32_,auVar269,auVar14);
  auVar3 = vfmadd231ps_fma(auVar238,auVar17,auVar269);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar265,auVar112);
  auVar260 = ZEXT1664(auVar4);
  auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar265,auVar221);
  auVar250 = ZEXT1664(auVar102);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar16,auVar265);
  auVar266._4_4_ = auVar99._0_4_;
  auVar266._0_4_ = auVar99._0_4_;
  auVar266._8_4_ = auVar99._0_4_;
  auVar266._12_4_ = auVar99._0_4_;
  auVar266._16_4_ = auVar99._0_4_;
  auVar266._20_4_ = auVar99._0_4_;
  auVar266._24_4_ = auVar99._0_4_;
  auVar266._28_4_ = auVar99._0_4_;
  auVar107 = vmovshdup_avx(auVar99);
  uVar98 = auVar107._0_8_;
  auVar270._8_8_ = uVar98;
  auVar270._0_8_ = uVar98;
  auVar270._16_8_ = uVar98;
  auVar270._24_8_ = uVar98;
  auVar107 = vshufps_avx(auVar99,auVar99,0xaa);
  fVar186 = auVar107._0_4_;
  auVar219._0_4_ = fVar186 * auVar13._0_4_;
  fVar200 = auVar107._4_4_;
  auVar219._4_4_ = fVar200 * auVar13._4_4_;
  auVar219._8_4_ = fVar186 * auVar13._8_4_;
  auVar219._12_4_ = fVar200 * auVar13._12_4_;
  auVar219._16_4_ = fVar186 * auVar13._16_4_;
  auVar219._20_4_ = fVar200 * auVar13._20_4_;
  auVar219._24_4_ = fVar186 * auVar13._24_4_;
  auVar219._28_4_ = 0;
  auVar214._4_4_ = auVar15._4_4_ * fVar200;
  auVar214._0_4_ = auVar15._0_4_ * fVar186;
  auVar214._8_4_ = auVar15._8_4_ * fVar186;
  auVar214._12_4_ = auVar15._12_4_ * fVar200;
  auVar214._16_4_ = auVar15._16_4_ * fVar186;
  auVar214._20_4_ = auVar15._20_4_ * fVar200;
  auVar214._24_4_ = auVar15._24_4_ * fVar186;
  auVar214._28_4_ = auVar13._28_4_;
  auVar13._4_4_ = auVar18._4_4_ * fVar200;
  auVar13._0_4_ = auVar18._0_4_ * fVar186;
  auVar13._8_4_ = auVar18._8_4_ * fVar186;
  auVar13._12_4_ = auVar18._12_4_ * fVar200;
  auVar13._16_4_ = auVar18._16_4_ * fVar186;
  auVar13._20_4_ = auVar18._20_4_ * fVar200;
  auVar13._24_4_ = auVar18._24_4_ * fVar186;
  auVar13._28_4_ = fVar200;
  auVar107 = vfmadd231ps_fma(auVar219,auVar270,auVar113);
  auVar237 = vfmadd231ps_fma(auVar214,auVar270,auVar14);
  auVar5 = vfmadd231ps_fma(auVar13,auVar270,auVar17);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar266,auVar112);
  auVar237 = vfmadd231ps_fma(ZEXT1632(auVar237),auVar266,auVar221);
  local_7a0._8_4_ = 0x7fffffff;
  local_7a0._0_8_ = 0x7fffffff7fffffff;
  local_7a0._12_4_ = 0x7fffffff;
  local_7a0._16_4_ = 0x7fffffff;
  local_7a0._20_4_ = 0x7fffffff;
  local_7a0._24_4_ = 0x7fffffff;
  local_7a0._28_4_ = 0x7fffffff;
  auVar225._8_4_ = 0x219392ef;
  auVar225._0_8_ = 0x219392ef219392ef;
  auVar225._12_4_ = 0x219392ef;
  auVar225._16_4_ = 0x219392ef;
  auVar225._20_4_ = 0x219392ef;
  auVar225._24_4_ = 0x219392ef;
  auVar225._28_4_ = 0x219392ef;
  auVar112 = vandps_avx(ZEXT1632(auVar4),local_7a0);
  auVar112 = vcmpps_avx(auVar112,auVar225,1);
  auVar113 = vblendvps_avx(ZEXT1632(auVar4),auVar225,auVar112);
  auVar112 = vandps_avx(ZEXT1632(auVar102),local_7a0);
  auVar112 = vcmpps_avx(auVar112,auVar225,1);
  auVar13 = vblendvps_avx(ZEXT1632(auVar102),auVar225,auVar112);
  auVar112 = vandps_avx(ZEXT1632(auVar3),local_7a0);
  auVar112 = vcmpps_avx(auVar112,auVar225,1);
  auVar112 = vblendvps_avx(ZEXT1632(auVar3),auVar225,auVar112);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar266,auVar16);
  auVar221 = vrcpps_avx(auVar113);
  auVar198._8_4_ = 0x3f800000;
  auVar198._0_8_ = 0x3f8000003f800000;
  auVar198._12_4_ = 0x3f800000;
  auVar198._16_4_ = 0x3f800000;
  auVar198._20_4_ = 0x3f800000;
  auVar198._24_4_ = 0x3f800000;
  auVar198._28_4_ = 0x3f800000;
  auVar107 = vfnmadd213ps_fma(auVar113,auVar221,auVar198);
  auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar221,auVar221);
  auVar113 = vrcpps_avx(auVar13);
  auVar102 = vfnmadd213ps_fma(auVar13,auVar113,auVar198);
  auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar113,auVar113);
  auVar113 = vrcpps_avx(auVar112);
  auVar3 = vfnmadd213ps_fma(auVar112,auVar113,auVar198);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar113,auVar113);
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 7 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar6));
  auVar221._4_4_ = auVar107._4_4_ * auVar112._4_4_;
  auVar221._0_4_ = auVar107._0_4_ * auVar112._0_4_;
  auVar221._8_4_ = auVar107._8_4_ * auVar112._8_4_;
  auVar221._12_4_ = auVar107._12_4_ * auVar112._12_4_;
  auVar221._16_4_ = auVar112._16_4_ * 0.0;
  auVar221._20_4_ = auVar112._20_4_ * 0.0;
  auVar221._24_4_ = auVar112._24_4_ * 0.0;
  auVar221._28_4_ = auVar112._28_4_;
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 9 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar6));
  auVar14._4_4_ = auVar107._4_4_ * auVar112._4_4_;
  auVar14._0_4_ = auVar107._0_4_ * auVar112._0_4_;
  auVar14._8_4_ = auVar107._8_4_ * auVar112._8_4_;
  auVar14._12_4_ = auVar107._12_4_ * auVar112._12_4_;
  auVar14._16_4_ = auVar112._16_4_ * 0.0;
  auVar14._20_4_ = auVar112._20_4_ * 0.0;
  auVar14._24_4_ = auVar112._24_4_ * 0.0;
  auVar14._28_4_ = auVar112._28_4_;
  auVar115._1_3_ = 0;
  auVar115[0] = PVar9;
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar9 * 0x10 + 6));
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar9 * 0x10 + uVar95 * -2 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar237));
  auVar15._4_4_ = auVar112._4_4_ * auVar102._4_4_;
  auVar15._0_4_ = auVar112._0_4_ * auVar102._0_4_;
  auVar15._8_4_ = auVar112._8_4_ * auVar102._8_4_;
  auVar15._12_4_ = auVar112._12_4_ * auVar102._12_4_;
  auVar15._16_4_ = auVar112._16_4_ * 0.0;
  auVar15._20_4_ = auVar112._20_4_ * 0.0;
  auVar15._24_4_ = auVar112._24_4_ * 0.0;
  auVar15._28_4_ = auVar112._28_4_;
  auVar112 = vcvtdq2ps_avx(auVar113);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar237));
  auVar16._4_4_ = auVar102._4_4_ * auVar112._4_4_;
  auVar16._0_4_ = auVar102._0_4_ * auVar112._0_4_;
  auVar16._8_4_ = auVar102._8_4_ * auVar112._8_4_;
  auVar16._12_4_ = auVar102._12_4_ * auVar112._12_4_;
  auVar16._16_4_ = auVar112._16_4_ * 0.0;
  auVar16._20_4_ = auVar112._20_4_ * 0.0;
  auVar16._24_4_ = auVar112._24_4_ * 0.0;
  auVar16._28_4_ = auVar112._28_4_;
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar93 + uVar95 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar4));
  auVar17._4_4_ = auVar112._4_4_ * auVar3._4_4_;
  auVar17._0_4_ = auVar112._0_4_ * auVar3._0_4_;
  auVar17._8_4_ = auVar112._8_4_ * auVar3._8_4_;
  auVar17._12_4_ = auVar112._12_4_ * auVar3._12_4_;
  auVar17._16_4_ = auVar112._16_4_ * 0.0;
  auVar17._20_4_ = auVar112._20_4_ * 0.0;
  auVar17._24_4_ = auVar112._24_4_ * 0.0;
  auVar17._28_4_ = auVar112._28_4_;
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 0x17 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar4));
  auVar18._4_4_ = auVar3._4_4_ * auVar112._4_4_;
  auVar18._0_4_ = auVar3._0_4_ * auVar112._0_4_;
  auVar18._8_4_ = auVar3._8_4_ * auVar112._8_4_;
  auVar18._12_4_ = auVar3._12_4_ * auVar112._12_4_;
  auVar18._16_4_ = auVar112._16_4_ * 0.0;
  auVar18._20_4_ = auVar112._20_4_ * 0.0;
  auVar18._24_4_ = auVar112._24_4_ * 0.0;
  auVar18._28_4_ = auVar112._28_4_;
  auVar112 = vpminsd_avx2(auVar221,auVar14);
  auVar113 = vpminsd_avx2(auVar15,auVar16);
  auVar112 = vmaxps_avx(auVar112,auVar113);
  uVar207 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar220._4_4_ = uVar207;
  auVar220._0_4_ = uVar207;
  auVar220._8_4_ = uVar207;
  auVar220._12_4_ = uVar207;
  auVar220._16_4_ = uVar207;
  auVar220._20_4_ = uVar207;
  auVar220._24_4_ = uVar207;
  auVar220._28_4_ = uVar207;
  auVar113 = vpminsd_avx2(auVar17,auVar18);
  auVar113 = vmaxps_avx(auVar113,auVar220);
  auVar112 = vmaxps_avx(auVar112,auVar113);
  local_2e0._4_4_ = auVar112._4_4_ * 0.99999964;
  local_2e0._0_4_ = auVar112._0_4_ * 0.99999964;
  local_2e0._8_4_ = auVar112._8_4_ * 0.99999964;
  local_2e0._12_4_ = auVar112._12_4_ * 0.99999964;
  local_2e0._16_4_ = auVar112._16_4_ * 0.99999964;
  local_2e0._20_4_ = auVar112._20_4_ * 0.99999964;
  local_2e0._24_4_ = auVar112._24_4_ * 0.99999964;
  local_2e0._28_4_ = auVar113._28_4_;
  auVar112 = vpmaxsd_avx2(auVar221,auVar14);
  auVar113 = vpmaxsd_avx2(auVar15,auVar16);
  auVar112 = vminps_avx(auVar112,auVar113);
  auVar113 = vpmaxsd_avx2(auVar17,auVar18);
  fVar186 = (ray->super_RayK<1>).tfar;
  auVar151._4_4_ = fVar186;
  auVar151._0_4_ = fVar186;
  auVar151._8_4_ = fVar186;
  auVar151._12_4_ = fVar186;
  auVar151._16_4_ = fVar186;
  auVar151._20_4_ = fVar186;
  auVar151._24_4_ = fVar186;
  auVar151._28_4_ = fVar186;
  auVar113 = vminps_avx(auVar113,auVar151);
  auVar112 = vminps_avx(auVar112,auVar113);
  auVar232._4_4_ = auVar112._4_4_ * 1.0000004;
  auVar232._0_4_ = auVar112._0_4_ * 1.0000004;
  auVar232._8_4_ = auVar112._8_4_ * 1.0000004;
  auVar232._12_4_ = auVar112._12_4_ * 1.0000004;
  auVar232._16_4_ = auVar112._16_4_ * 1.0000004;
  auVar232._20_4_ = auVar112._20_4_ * 1.0000004;
  auVar232._24_4_ = auVar112._24_4_ * 1.0000004;
  auVar232._28_4_ = auVar112._28_4_;
  auVar115[4] = PVar9;
  auVar115._5_3_ = 0;
  auVar115[8] = PVar9;
  auVar115._9_3_ = 0;
  auVar115[0xc] = PVar9;
  auVar115._13_3_ = 0;
  auVar115[0x10] = PVar9;
  auVar115._17_3_ = 0;
  auVar115[0x14] = PVar9;
  auVar115._21_3_ = 0;
  auVar115[0x18] = PVar9;
  auVar115._25_3_ = 0;
  auVar115[0x1c] = PVar9;
  auVar115._29_3_ = 0;
  auVar113 = vpcmpgtd_avx2(auVar115,_DAT_01fe9900);
  auVar112 = vcmpps_avx(local_2e0,auVar232,2);
  auVar112 = vandps_avx(auVar112,auVar113);
  uVar90 = vmovmskps_avx(auVar112);
  if (uVar90 == 0) {
    return;
  }
  uVar90 = uVar90 & 0xff;
  auVar112._16_16_ = mm_lookupmask_ps._240_16_;
  auVar112._0_16_ = mm_lookupmask_ps._240_16_;
  local_2c0 = vblendps_avx(auVar112,ZEXT832(0) << 0x20,0x80);
  local_600 = 0x80000000;
  uStack_5fc = 0x80000000;
  uStack_5f8 = 0x80000000;
  uStack_5f4 = 0x80000000;
  fStack_5f0 = -0.0;
  fStack_5ec = -0.0;
  fStack_5e8 = -0.0;
  uStack_5e4 = 0x80000000;
  local_7a8 = prim;
LAB_01786260:
  lVar91 = 0;
  uVar93 = (ulong)uVar90;
  for (uVar95 = uVar93; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x8000000000000000) {
    lVar91 = lVar91 + 1;
  }
  uVar93 = uVar93 - 1 & uVar93;
  uVar207 = *(undefined4 *)(local_7a8 + lVar91 * 4 + 6);
  uVar95 = (ulong)(uint)((int)lVar91 << 6);
  auVar107 = *(undefined1 (*) [16])(prim + uVar95 + lVar69 + 0x16);
  if (uVar93 != 0) {
    uVar92 = uVar93 - 1 & uVar93;
    for (uVar20 = uVar93; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
    }
    if (uVar92 != 0) {
      for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar102 = *(undefined1 (*) [16])(prim + uVar95 + lVar69 + 0x26);
  auVar3 = *(undefined1 (*) [16])(prim + uVar95 + lVar69 + 0x36);
  auVar4 = *(undefined1 (*) [16])(prim + uVar95 + lVar69 + 0x46);
  auVar208._0_4_ = (auVar107._0_4_ + auVar102._0_4_ + auVar3._0_4_ + auVar4._0_4_) * 0.25;
  auVar208._4_4_ = (auVar107._4_4_ + auVar102._4_4_ + auVar3._4_4_ + auVar4._4_4_) * 0.25;
  auVar208._8_4_ = (auVar107._8_4_ + auVar102._8_4_ + auVar3._8_4_ + auVar4._8_4_) * 0.25;
  auVar208._12_4_ = (auVar107._12_4_ + auVar102._12_4_ + auVar3._12_4_ + auVar4._12_4_) * 0.25;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar237 = vsubps_avx(auVar208,(undefined1  [16])aVar1);
  auVar237 = vdpps_avx(auVar237,(undefined1  [16])aVar2,0x7f);
  auVar5 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  uVar90 = *(uint *)(local_7a8 + 2);
  auVar6 = vrcpss_avx(auVar5,auVar5);
  auVar5 = vfnmadd213ss_fma(auVar6,auVar5,ZEXT416(0x40000000));
  auVar241 = ZEXT1664(auVar5);
  fVar186 = auVar6._0_4_ * auVar5._0_4_;
  auVar223 = ZEXT464((uint)fVar186);
  fVar186 = auVar237._0_4_ * fVar186;
  local_7c0 = ZEXT416((uint)fVar186);
  auVar209._4_4_ = fVar186;
  auVar209._0_4_ = fVar186;
  auVar209._8_4_ = fVar186;
  auVar209._12_4_ = fVar186;
  fStack_7d0 = fVar186;
  _local_7e0 = auVar209;
  fStack_7cc = fVar186;
  fStack_7c8 = fVar186;
  fStack_7c4 = fVar186;
  auVar237 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar209);
  auVar237 = vblendps_avx(auVar237,_DAT_01f7aa10,8);
  local_9f0 = vsubps_avx(auVar107,auVar237);
  local_a00 = vsubps_avx(auVar3,auVar237);
  local_a10 = vsubps_avx(auVar102,auVar237);
  _local_a20 = vsubps_avx(auVar4,auVar237);
  auVar107 = vmovshdup_avx(local_9f0);
  local_1e0 = auVar107._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar107 = vshufps_avx(local_9f0,local_9f0,0xaa);
  local_360 = auVar107._0_8_;
  uStack_358 = local_360;
  uStack_350 = local_360;
  uStack_348 = local_360;
  auVar107 = vshufps_avx(local_9f0,local_9f0,0xff);
  local_380 = auVar107._0_8_;
  uStack_378 = local_380;
  uStack_370 = local_380;
  uStack_368 = local_380;
  auVar107 = vmovshdup_avx(local_a10);
  local_3a0 = auVar107._0_8_;
  uStack_398 = local_3a0;
  uStack_390 = local_3a0;
  uStack_388 = local_3a0;
  auVar107 = vshufps_avx(local_a10,local_a10,0xaa);
  local_200 = auVar107._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar107 = vshufps_avx(local_a10,local_a10,0xff);
  local_220 = auVar107._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar107 = vmovshdup_avx(local_a00);
  uVar98 = auVar107._0_8_;
  local_480._8_8_ = uVar98;
  local_480._0_8_ = uVar98;
  local_480._16_8_ = uVar98;
  local_480._24_8_ = uVar98;
  auVar107 = vshufps_avx(local_a00,local_a00,0xaa);
  local_240 = auVar107._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar107 = vshufps_avx(local_a00,local_a00,0xff);
  local_260 = auVar107._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar107 = vmovshdup_avx(_local_a20);
  local_3c0 = auVar107._0_8_;
  uStack_3b8 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3a8 = local_3c0;
  auVar107 = vshufps_avx(_local_a20,_local_a20,0xaa);
  local_3e0 = auVar107._0_8_;
  uStack_3d8 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3c8 = local_3e0;
  auVar107 = vshufps_avx(_local_a20,_local_a20,0xff);
  local_400 = auVar107._0_8_;
  uStack_3f8 = local_400;
  uStack_3f0 = local_400;
  uStack_3e8 = local_400;
  auVar100._0_4_ = aVar2.x * aVar2.x;
  auVar100._4_4_ = aVar2.y * aVar2.y;
  auVar100._8_4_ = aVar2.z * aVar2.z;
  auVar100._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar107 = vshufps_avx(auVar100,auVar100,0xaa);
  auVar113._0_8_ = auVar107._0_8_;
  auVar113._8_8_ = auVar113._0_8_;
  auVar113._16_8_ = auVar113._0_8_;
  auVar113._24_8_ = auVar113._0_8_;
  uVar97 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_780._4_4_ = uVar97;
  local_780._0_4_ = uVar97;
  fStack_778 = (float)uVar97;
  fStack_774 = (float)uVar97;
  fStack_770 = (float)uVar97;
  fStack_76c = (float)uVar97;
  fStack_768 = (float)uVar97;
  register0x0000125c = uVar97;
  uVar97 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_580._4_4_ = uVar97;
  local_580._0_4_ = uVar97;
  fStack_578 = (float)uVar97;
  fStack_574 = (float)uVar97;
  fStack_570 = (float)uVar97;
  fStack_56c = (float)uVar97;
  fStack_568 = (float)uVar97;
  register0x0000135c = uVar97;
  auVar107 = vfmadd231ps_fma(auVar113,_local_580,_local_580);
  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),_local_780,_local_780);
  local_aec = 1;
  uVar95 = 0;
  local_5e0 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_5dc = local_5e0;
  fStack_5d8 = local_5e0;
  fStack_5d4 = local_5e0;
  fStack_5d0 = local_5e0;
  fStack_5cc = local_5e0;
  fStack_5c8 = local_5e0;
  fStack_5c4 = local_5e0;
  local_420 = local_9f0._0_4_;
  uStack_41c = local_420;
  uStack_418 = local_420;
  uStack_414 = local_420;
  uStack_410 = local_420;
  uStack_40c = local_420;
  uStack_408 = local_420;
  uStack_404 = local_420;
  local_2a0 = local_a10._0_4_;
  uStack_29c = local_2a0;
  uStack_298 = local_2a0;
  uStack_294 = local_2a0;
  uStack_290 = local_2a0;
  uStack_28c = local_2a0;
  uStack_288 = local_2a0;
  uStack_284 = local_2a0;
  local_440 = local_a00._0_4_;
  uStack_43c = local_440;
  uStack_438 = local_440;
  uStack_434 = local_440;
  uStack_430 = local_440;
  uStack_42c = local_440;
  uStack_428 = local_440;
  uStack_424 = local_440;
  local_460 = local_a20._0_4_;
  fStack_45c = local_460;
  fStack_458 = local_460;
  fStack_454 = local_460;
  fStack_450 = local_460;
  fStack_44c = local_460;
  fStack_448 = local_460;
  fStack_444 = local_460;
  local_280 = ZEXT1632(auVar107);
  local_4a0 = vandps_avx(ZEXT1632(auVar107),local_7a0);
  local_530 = ZEXT816(0x3f80000000000000);
  do {
    auVar179._8_4_ = 0x3f800000;
    auVar179._0_8_ = 0x3f8000003f800000;
    auVar179._12_4_ = 0x3f800000;
    auVar179._16_4_ = 0x3f800000;
    auVar179._20_4_ = 0x3f800000;
    iVar94 = (int)uVar95;
    auVar179._24_4_ = 0x3f800000;
    auVar179._28_4_ = 0x3f800000;
    auVar107 = vmovshdup_avx(local_530);
    auVar107 = vsubps_avx(auVar107,local_530);
    local_800._0_4_ = auVar107._0_4_;
    fVar254 = (float)local_800._0_4_ * 0.04761905;
    uVar97 = local_530._0_4_;
    local_760._4_4_ = uVar97;
    local_760._0_4_ = uVar97;
    local_760._8_4_ = uVar97;
    local_760._12_4_ = uVar97;
    local_760._16_4_ = uVar97;
    local_760._20_4_ = uVar97;
    local_760._24_4_ = uVar97;
    local_760._28_4_ = uVar97;
    local_800._4_4_ = local_800._0_4_;
    local_800._8_4_ = local_800._0_4_;
    local_800._12_4_ = local_800._0_4_;
    local_800._16_4_ = local_800._0_4_;
    local_800._20_4_ = local_800._0_4_;
    local_800._24_4_ = local_800._0_4_;
    local_800._28_4_ = local_800._0_4_;
    auVar107 = vfmadd231ps_fma(local_760,local_800,_DAT_01faff20);
    auVar112 = vsubps_avx(auVar179,ZEXT1632(auVar107));
    fVar186 = auVar112._0_4_;
    fVar201 = auVar112._4_4_;
    fVar268 = auVar112._8_4_;
    fVar272 = auVar112._12_4_;
    fVar204 = auVar112._16_4_;
    fVar205 = auVar112._20_4_;
    fVar206 = auVar112._24_4_;
    fVar96 = fVar186 * fVar186 * fVar186;
    fVar122 = fVar201 * fVar201 * fVar201;
    fVar123 = fVar268 * fVar268 * fVar268;
    fVar124 = fVar272 * fVar272 * fVar272;
    fVar125 = fVar204 * fVar204 * fVar204;
    fVar126 = fVar205 * fVar205 * fVar205;
    fVar127 = fVar206 * fVar206 * fVar206;
    fVar200 = auVar107._0_4_;
    fVar202 = auVar107._4_4_;
    fVar271 = auVar107._8_4_;
    fVar203 = auVar107._12_4_;
    fVar142 = fVar200 * fVar200 * fVar200;
    fVar162 = fVar202 * fVar202 * fVar202;
    fVar163 = fVar271 * fVar271 * fVar271;
    fVar164 = fVar203 * fVar203 * fVar203;
    fVar236 = fVar186 * fVar200;
    fVar242 = fVar201 * fVar202;
    fVar243 = fVar268 * fVar271;
    fVar244 = fVar272 * fVar203;
    fVar245 = fVar204 * 0.0;
    fVar246 = fVar205 * 0.0;
    fVar247 = fVar206 * 0.0;
    fVar251 = auVar250._28_4_ + auVar260._28_4_;
    auVar21._4_4_ = fVar122 * 0.16666667;
    auVar21._0_4_ = fVar96 * 0.16666667;
    auVar21._8_4_ = fVar123 * 0.16666667;
    auVar21._12_4_ = fVar124 * 0.16666667;
    auVar21._16_4_ = fVar125 * 0.16666667;
    auVar21._20_4_ = fVar126 * 0.16666667;
    auVar21._24_4_ = fVar127 * 0.16666667;
    auVar21._28_4_ = fVar251 + (float)local_800._0_4_;
    auVar22._4_4_ =
         (fVar201 * fVar242 * 12.0 + fVar242 * fVar202 * 6.0 + fVar162 + fVar122 * 4.0) * 0.16666667
    ;
    auVar22._0_4_ =
         (fVar186 * fVar236 * 12.0 + fVar236 * fVar200 * 6.0 + fVar142 + fVar96 * 4.0) * 0.16666667;
    auVar22._8_4_ =
         (fVar268 * fVar243 * 12.0 + fVar243 * fVar271 * 6.0 + fVar163 + fVar123 * 4.0) * 0.16666667
    ;
    auVar22._12_4_ =
         (fVar272 * fVar244 * 12.0 + fVar244 * fVar203 * 6.0 + fVar164 + fVar124 * 4.0) * 0.16666667
    ;
    auVar22._16_4_ =
         (fVar204 * fVar245 * 12.0 + fVar245 * 0.0 * 6.0 + fVar125 * 4.0 + 0.0) * 0.16666667;
    auVar22._20_4_ =
         (fVar205 * fVar246 * 12.0 + fVar246 * 0.0 * 6.0 + fVar126 * 4.0 + 0.0) * 0.16666667;
    auVar22._24_4_ =
         (fVar206 * fVar247 * 12.0 + fVar247 * 0.0 * 6.0 + fVar127 * 4.0 + 0.0) * 0.16666667;
    auVar22._28_4_ = auVar253._28_4_;
    auVar23._4_4_ =
         (fVar162 * 4.0 + fVar122 + fVar242 * fVar202 * 12.0 + fVar201 * fVar242 * 6.0) * 0.16666667
    ;
    auVar23._0_4_ =
         (fVar142 * 4.0 + fVar96 + fVar236 * fVar200 * 12.0 + fVar186 * fVar236 * 6.0) * 0.16666667;
    auVar23._8_4_ =
         (fVar163 * 4.0 + fVar123 + fVar243 * fVar271 * 12.0 + fVar268 * fVar243 * 6.0) * 0.16666667
    ;
    auVar23._12_4_ =
         (fVar164 * 4.0 + fVar124 + fVar244 * fVar203 * 12.0 + fVar272 * fVar244 * 6.0) * 0.16666667
    ;
    auVar23._16_4_ = (fVar125 + 0.0 + fVar245 * 0.0 * 12.0 + fVar204 * fVar245 * 6.0) * 0.16666667;
    auVar23._20_4_ = (fVar126 + 0.0 + fVar246 * 0.0 * 12.0 + fVar205 * fVar246 * 6.0) * 0.16666667;
    auVar23._24_4_ = (fVar127 + 0.0 + fVar247 * 0.0 * 12.0 + fVar206 * fVar247 * 6.0) * 0.16666667;
    auVar23._28_4_ = auVar260._28_4_;
    fVar142 = fVar142 * 0.16666667;
    fVar162 = fVar162 * 0.16666667;
    fVar163 = fVar163 * 0.16666667;
    fVar164 = fVar164 * 0.16666667;
    auVar24._4_4_ = fVar162 * fStack_45c;
    auVar24._0_4_ = fVar142 * local_460;
    auVar24._8_4_ = fVar163 * fStack_458;
    auVar24._12_4_ = fVar164 * fStack_454;
    auVar24._16_4_ = fStack_450 * 0.0;
    auVar24._20_4_ = fStack_44c * 0.0;
    auVar24._24_4_ = fStack_448 * 0.0;
    auVar24._28_4_ = local_800._0_4_;
    auVar25._4_4_ = fVar162 * local_3c0._4_4_;
    auVar25._0_4_ = fVar142 * (float)local_3c0;
    auVar25._8_4_ = fVar163 * (float)uStack_3b8;
    auVar25._12_4_ = fVar164 * uStack_3b8._4_4_;
    auVar25._16_4_ = (float)uStack_3b0 * 0.0;
    auVar25._20_4_ = uStack_3b0._4_4_ * 0.0;
    auVar25._24_4_ = (float)uStack_3a8 * 0.0;
    auVar25._28_4_ = fVar251 + DAT_01faff20._28_4_ + 0.0;
    auVar26._4_4_ = fVar162 * local_3e0._4_4_;
    auVar26._0_4_ = fVar142 * (float)local_3e0;
    auVar26._8_4_ = fVar163 * (float)uStack_3d8;
    auVar26._12_4_ = fVar164 * uStack_3d8._4_4_;
    auVar26._16_4_ = (float)uStack_3d0 * 0.0;
    auVar26._20_4_ = uStack_3d0._4_4_ * 0.0;
    auVar26._24_4_ = (float)uStack_3c8 * 0.0;
    auVar26._28_4_ = 0;
    auVar27._4_4_ = fVar162 * local_400._4_4_;
    auVar27._0_4_ = fVar142 * (float)local_400;
    auVar27._8_4_ = fVar163 * (float)uStack_3f8;
    auVar27._12_4_ = fVar164 * uStack_3f8._4_4_;
    auVar27._16_4_ = (float)uStack_3f0 * 0.0;
    auVar27._20_4_ = uStack_3f0._4_4_ * 0.0;
    auVar27._24_4_ = (float)uStack_3e8 * 0.0;
    auVar27._28_4_ = 0x40c00000;
    auVar70._4_4_ = uStack_43c;
    auVar70._0_4_ = local_440;
    auVar70._8_4_ = uStack_438;
    auVar70._12_4_ = uStack_434;
    auVar70._16_4_ = uStack_430;
    auVar70._20_4_ = uStack_42c;
    auVar70._24_4_ = uStack_428;
    auVar70._28_4_ = uStack_424;
    auVar107 = vfmadd231ps_fma(auVar24,auVar23,auVar70);
    auVar102 = vfmadd231ps_fma(auVar25,auVar23,local_480);
    auVar82._8_8_ = uStack_238;
    auVar82._0_8_ = local_240;
    auVar82._16_8_ = uStack_230;
    auVar82._24_8_ = uStack_228;
    auVar3 = vfmadd231ps_fma(auVar26,auVar23,auVar82);
    auVar81._8_8_ = uStack_258;
    auVar81._0_8_ = local_260;
    auVar81._16_8_ = uStack_250;
    auVar81._24_8_ = uStack_248;
    auVar4 = vfmadd231ps_fma(auVar27,auVar81,auVar23);
    auVar80._4_4_ = uStack_29c;
    auVar80._0_4_ = local_2a0;
    auVar80._8_4_ = uStack_298;
    auVar80._12_4_ = uStack_294;
    auVar80._16_4_ = uStack_290;
    auVar80._20_4_ = uStack_28c;
    auVar80._24_4_ = uStack_288;
    auVar80._28_4_ = uStack_284;
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar22,auVar80);
    auVar74._8_8_ = uStack_398;
    auVar74._0_8_ = local_3a0;
    auVar74._16_8_ = uStack_390;
    auVar74._24_8_ = uStack_388;
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar22,auVar74);
    auVar84._8_8_ = uStack_1f8;
    auVar84._0_8_ = local_200;
    auVar84._16_8_ = uStack_1f0;
    auVar84._24_8_ = uStack_1e8;
    auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar22,auVar84);
    auVar83._8_8_ = uStack_218;
    auVar83._0_8_ = local_220;
    auVar83._16_8_ = uStack_210;
    auVar83._24_8_ = uStack_208;
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar83,auVar22);
    auVar72._4_4_ = uStack_41c;
    auVar72._0_4_ = local_420;
    auVar72._8_4_ = uStack_418;
    auVar72._12_4_ = uStack_414;
    auVar72._16_4_ = uStack_410;
    auVar72._20_4_ = uStack_40c;
    auVar72._24_4_ = uStack_408;
    auVar72._28_4_ = uStack_404;
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar21,auVar72);
    auVar214 = ZEXT1632(auVar107);
    auVar85._8_8_ = uStack_1d8;
    auVar85._0_8_ = local_1e0;
    auVar85._16_8_ = uStack_1d0;
    auVar85._24_8_ = uStack_1c8;
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar21,auVar85);
    local_980 = ZEXT1632(auVar107);
    auVar78._8_8_ = uStack_358;
    auVar78._0_8_ = local_360;
    auVar78._16_8_ = uStack_350;
    auVar78._24_8_ = uStack_348;
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar21,auVar78);
    auVar76._8_8_ = uStack_378;
    auVar76._0_8_ = local_380;
    auVar76._16_8_ = uStack_370;
    auVar76._24_8_ = uStack_368;
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar21,auVar76);
    auVar217._0_4_ = (float)((uint)fVar200 ^ local_600) * fVar200;
    auVar217._4_4_ = (float)((uint)fVar202 ^ uStack_5fc) * fVar202;
    auVar217._8_4_ = (float)((uint)fVar271 ^ uStack_5f8) * fVar271;
    auVar217._12_4_ = (float)((uint)fVar203 ^ uStack_5f4) * fVar203;
    auVar217._16_4_ = fStack_5f0 * 0.0;
    auVar217._20_4_ = fStack_5ec * 0.0;
    auVar217._24_4_ = fStack_5e8 * 0.0;
    auVar217._28_4_ = 0;
    auVar28._4_4_ = fVar242 * 4.0;
    auVar28._0_4_ = fVar236 * 4.0;
    auVar28._8_4_ = fVar243 * 4.0;
    auVar28._12_4_ = fVar244 * 4.0;
    auVar28._16_4_ = fVar245 * 4.0;
    auVar28._20_4_ = fVar246 * 4.0;
    fVar96 = auVar241._28_4_;
    auVar28._24_4_ = fVar247 * 4.0;
    auVar28._28_4_ = fVar96;
    auVar113 = vsubps_avx(auVar217,auVar28);
    auVar29._4_4_ = fVar201 * (float)((uint)fVar201 ^ uStack_5fc) * 0.5;
    auVar29._0_4_ = fVar186 * (float)((uint)fVar186 ^ local_600) * 0.5;
    auVar29._8_4_ = fVar268 * (float)((uint)fVar268 ^ uStack_5f8) * 0.5;
    auVar29._12_4_ = fVar272 * (float)((uint)fVar272 ^ uStack_5f4) * 0.5;
    auVar29._16_4_ = fVar204 * (float)((uint)fVar204 ^ (uint)fStack_5f0) * 0.5;
    auVar29._20_4_ = fVar205 * (float)((uint)fVar205 ^ (uint)fStack_5ec) * 0.5;
    auVar29._24_4_ = fVar206 * (float)((uint)fVar206 ^ (uint)fStack_5e8) * 0.5;
    auVar29._28_4_ = auVar112._28_4_;
    auVar30._4_4_ = auVar113._4_4_ * 0.5;
    auVar30._0_4_ = auVar113._0_4_ * 0.5;
    auVar30._8_4_ = auVar113._8_4_ * 0.5;
    auVar30._12_4_ = auVar113._12_4_ * 0.5;
    auVar30._16_4_ = auVar113._16_4_ * 0.5;
    auVar30._20_4_ = auVar113._20_4_ * 0.5;
    auVar30._24_4_ = auVar113._24_4_ * 0.5;
    auVar30._28_4_ = auVar113._28_4_;
    auVar31._4_4_ = (fVar242 * 4.0 + fVar201 * fVar201) * 0.5;
    auVar31._0_4_ = (fVar236 * 4.0 + fVar186 * fVar186) * 0.5;
    auVar31._8_4_ = (fVar243 * 4.0 + fVar268 * fVar268) * 0.5;
    auVar31._12_4_ = (fVar244 * 4.0 + fVar272 * fVar272) * 0.5;
    auVar31._16_4_ = (fVar245 * 4.0 + fVar204 * fVar204) * 0.5;
    auVar31._20_4_ = (fVar246 * 4.0 + fVar205 * fVar205) * 0.5;
    auVar31._24_4_ = (fVar247 * 4.0 + fVar206 * fVar206) * 0.5;
    auVar31._28_4_ = fVar96 + auVar223._28_4_;
    fVar186 = fVar200 * fVar200 * 0.5;
    fVar200 = fVar202 * fVar202 * 0.5;
    fVar201 = fVar271 * fVar271 * 0.5;
    fVar202 = fVar203 * fVar203 * 0.5;
    auVar32._4_4_ = fVar200 * fStack_45c;
    auVar32._0_4_ = fVar186 * local_460;
    auVar32._8_4_ = fVar201 * fStack_458;
    auVar32._12_4_ = fVar202 * fStack_454;
    auVar32._16_4_ = fStack_450 * 0.0;
    auVar32._20_4_ = fStack_44c * 0.0;
    auVar32._24_4_ = fStack_448 * 0.0;
    auVar32._28_4_ = fVar96;
    auVar33._4_4_ = fVar200 * local_3c0._4_4_;
    auVar33._0_4_ = fVar186 * (float)local_3c0;
    auVar33._8_4_ = fVar201 * (float)uStack_3b8;
    auVar33._12_4_ = fVar202 * uStack_3b8._4_4_;
    auVar33._16_4_ = (float)uStack_3b0 * 0.0;
    auVar33._20_4_ = uStack_3b0._4_4_ * 0.0;
    auVar33._24_4_ = (float)uStack_3a8 * 0.0;
    auVar33._28_4_ = uStack_5e4;
    auVar34._4_4_ = fVar200 * local_3e0._4_4_;
    auVar34._0_4_ = fVar186 * (float)local_3e0;
    auVar34._8_4_ = fVar201 * (float)uStack_3d8;
    auVar34._12_4_ = fVar202 * uStack_3d8._4_4_;
    auVar34._16_4_ = (float)uStack_3d0 * 0.0;
    auVar34._20_4_ = uStack_3d0._4_4_ * 0.0;
    auVar34._24_4_ = (float)uStack_3c8 * 0.0;
    auVar34._28_4_ = auVar253._28_4_;
    auVar35._4_4_ = fVar200 * local_400._4_4_;
    auVar35._0_4_ = fVar186 * (float)local_400;
    auVar35._8_4_ = fVar201 * (float)uStack_3f8;
    auVar35._12_4_ = fVar202 * uStack_3f8._4_4_;
    auVar35._16_4_ = (float)uStack_3f0 * 0.0;
    auVar35._20_4_ = uStack_3f0._4_4_ * 0.0;
    auVar35._24_4_ = (float)uStack_3e8 * 0.0;
    auVar35._28_4_ = 0;
    auVar71._4_4_ = uStack_43c;
    auVar71._0_4_ = local_440;
    auVar71._8_4_ = uStack_438;
    auVar71._12_4_ = uStack_434;
    auVar71._16_4_ = uStack_430;
    auVar71._20_4_ = uStack_42c;
    auVar71._24_4_ = uStack_428;
    auVar71._28_4_ = uStack_424;
    auVar3 = vfmadd231ps_fma(auVar32,auVar31,auVar71);
    auVar4 = vfmadd231ps_fma(auVar33,auVar31,local_480);
    auVar237 = vfmadd231ps_fma(auVar34,auVar31,auVar82);
    auVar5 = vfmadd231ps_fma(auVar35,auVar81,auVar31);
    auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar30,auVar80);
    auVar75._8_8_ = uStack_398;
    auVar75._0_8_ = local_3a0;
    auVar75._16_8_ = uStack_390;
    auVar75._24_8_ = uStack_388;
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar30,auVar75);
    auVar237 = vfmadd231ps_fma(ZEXT1632(auVar237),auVar30,auVar84);
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar83,auVar30);
    auVar73._4_4_ = uStack_41c;
    auVar73._0_4_ = local_420;
    auVar73._8_4_ = uStack_418;
    auVar73._12_4_ = uStack_414;
    auVar73._16_4_ = uStack_410;
    auVar73._20_4_ = uStack_40c;
    auVar73._24_4_ = uStack_408;
    auVar73._28_4_ = uStack_404;
    auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar29,auVar73);
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar29,auVar85);
    auVar79._8_8_ = uStack_358;
    auVar79._0_8_ = local_360;
    auVar79._16_8_ = uStack_350;
    auVar79._24_8_ = uStack_348;
    auVar237 = vfmadd231ps_fma(ZEXT1632(auVar237),auVar29,auVar79);
    auVar77._8_8_ = uStack_378;
    auVar77._0_8_ = local_380;
    auVar77._16_8_ = uStack_370;
    auVar77._24_8_ = uStack_368;
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar29,auVar77);
    fVar186 = auVar3._0_4_ * fVar254;
    fVar200 = auVar3._4_4_ * fVar254;
    local_820._4_4_ = fVar200;
    local_820._0_4_ = fVar186;
    fVar201 = auVar3._8_4_ * fVar254;
    local_820._8_4_ = fVar201;
    fVar202 = auVar3._12_4_ * fVar254;
    local_820._12_4_ = fVar202;
    local_820._16_4_ = fVar254 * 0.0;
    local_820._20_4_ = fVar254 * 0.0;
    uVar97 = (undefined4)((ulong)uStack_248 >> 0x20);
    local_820._24_4_ = fVar254 * 0.0;
    local_820._28_4_ = uVar97;
    fVar268 = auVar4._0_4_ * fVar254;
    fVar271 = auVar4._4_4_ * fVar254;
    local_840._4_4_ = fVar271;
    local_840._0_4_ = fVar268;
    fVar272 = auVar4._8_4_ * fVar254;
    local_840._8_4_ = fVar272;
    fVar142 = auVar4._12_4_ * fVar254;
    local_840._12_4_ = fVar142;
    local_840._16_4_ = fVar254 * 0.0;
    local_840._20_4_ = fVar254 * 0.0;
    local_840._24_4_ = fVar254 * 0.0;
    local_840._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    local_a40._0_4_ = auVar237._0_4_ * fVar254;
    local_a40._4_4_ = auVar237._4_4_ * fVar254;
    local_a40._8_4_ = auVar237._8_4_ * fVar254;
    local_a40._12_4_ = auVar237._12_4_ * fVar254;
    local_a40._16_4_ = fVar254 * 0.0;
    local_a40._20_4_ = fVar254 * 0.0;
    local_a40._24_4_ = fVar254 * 0.0;
    local_a40._28_4_ = 0;
    auVar195._0_4_ = fVar254 * auVar5._0_4_;
    auVar195._4_4_ = fVar254 * auVar5._4_4_;
    auVar195._8_4_ = fVar254 * auVar5._8_4_;
    auVar195._12_4_ = fVar254 * auVar5._12_4_;
    auVar195._16_4_ = fVar254 * 0.0;
    auVar195._20_4_ = fVar254 * 0.0;
    auVar195._24_4_ = fVar254 * 0.0;
    auVar195._28_4_ = 0;
    _local_9e0 = vpermps_avx2(_DAT_01fec480,auVar214);
    _local_900 = vpermps_avx2(_DAT_01fec480,local_980);
    local_a80 = ZEXT1632(auVar107);
    local_920 = vpermps_avx2(_DAT_01fec480,local_a80);
    local_640 = vsubps_avx(_local_9e0,auVar214);
    local_620 = vsubps_avx(local_920,ZEXT1632(auVar107));
    fVar203 = local_620._0_4_;
    fVar204 = local_620._4_4_;
    auVar36._4_4_ = fVar204 * fVar200;
    auVar36._0_4_ = fVar203 * fVar186;
    fVar205 = local_620._8_4_;
    auVar36._8_4_ = fVar205 * fVar201;
    fVar206 = local_620._12_4_;
    auVar36._12_4_ = fVar206 * fVar202;
    fVar96 = local_620._16_4_;
    auVar36._16_4_ = fVar96 * fVar254 * 0.0;
    fVar122 = local_620._20_4_;
    auVar36._20_4_ = fVar122 * fVar254 * 0.0;
    fVar123 = local_620._24_4_;
    auVar36._24_4_ = fVar123 * fVar254 * 0.0;
    auVar36._28_4_ = local_9e0._28_4_;
    auVar107 = vfmsub231ps_fma(auVar36,local_a40,local_640);
    _local_660 = vsubps_avx(_local_900,local_980);
    fVar124 = local_640._0_4_;
    fVar125 = local_640._4_4_;
    auVar37._4_4_ = fVar125 * fVar271;
    auVar37._0_4_ = fVar124 * fVar268;
    fVar126 = local_640._8_4_;
    auVar37._8_4_ = fVar126 * fVar272;
    fVar127 = local_640._12_4_;
    auVar37._12_4_ = fVar127 * fVar142;
    fVar142 = local_640._16_4_;
    auVar37._16_4_ = fVar142 * fVar254 * 0.0;
    fVar162 = local_640._20_4_;
    auVar37._20_4_ = fVar162 * fVar254 * 0.0;
    fVar163 = local_640._24_4_;
    auVar37._24_4_ = fVar163 * fVar254 * 0.0;
    auVar37._28_4_ = local_900._28_4_;
    auVar3 = vfmsub231ps_fma(auVar37,local_820,_local_660);
    auVar107 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar3._12_4_ * auVar3._12_4_,
                                                  CONCAT48(auVar3._8_4_ * auVar3._8_4_,
                                                           CONCAT44(auVar3._4_4_ * auVar3._4_4_,
                                                                    auVar3._0_4_ * auVar3._0_4_)))),
                               ZEXT1632(auVar107),ZEXT1632(auVar107));
    fVar254 = local_660._0_4_;
    fVar164 = local_660._4_4_;
    auVar38._4_4_ = fVar164 * local_a40._4_4_;
    auVar38._0_4_ = fVar254 * (float)local_a40._0_4_;
    fVar236 = local_660._8_4_;
    auVar38._8_4_ = fVar236 * local_a40._8_4_;
    fVar242 = local_660._12_4_;
    auVar38._12_4_ = fVar242 * local_a40._12_4_;
    fVar243 = local_660._16_4_;
    auVar38._16_4_ = fVar243 * local_a40._16_4_;
    fVar244 = local_660._20_4_;
    auVar38._20_4_ = fVar244 * local_a40._20_4_;
    fVar245 = local_660._24_4_;
    auVar38._24_4_ = fVar245 * local_a40._24_4_;
    auVar38._28_4_ = local_920._28_4_;
    auVar4 = vfmsub231ps_fma(auVar38,local_840,local_620);
    auVar180._0_4_ = fVar203 * fVar203;
    auVar180._4_4_ = fVar204 * fVar204;
    auVar180._8_4_ = fVar205 * fVar205;
    auVar180._12_4_ = fVar206 * fVar206;
    auVar180._16_4_ = fVar96 * fVar96;
    auVar180._20_4_ = fVar122 * fVar122;
    auVar180._24_4_ = fVar123 * fVar123;
    auVar180._28_4_ = 0;
    auVar3 = vfmadd231ps_fma(auVar180,_local_660,_local_660);
    auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),local_640,local_640);
    auVar112 = vrcpps_avx(ZEXT1632(auVar3));
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT1632(auVar4),ZEXT1632(auVar4));
    auVar114._8_4_ = 0x3f800000;
    auVar114._0_8_ = 0x3f8000003f800000;
    auVar114._12_4_ = 0x3f800000;
    auVar114._16_4_ = 0x3f800000;
    auVar114._20_4_ = 0x3f800000;
    auVar114._24_4_ = 0x3f800000;
    auVar114._28_4_ = 0x3f800000;
    auVar107 = vfnmadd213ps_fma(auVar112,ZEXT1632(auVar3),auVar114);
    auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar112,auVar112);
    local_a60 = vpermps_avx2(_DAT_01fec480,local_820);
    local_940 = vpermps_avx2(_DAT_01fec480,local_a40);
    auVar39._4_4_ = fVar204 * local_a60._4_4_;
    auVar39._0_4_ = fVar203 * local_a60._0_4_;
    auVar39._8_4_ = fVar205 * local_a60._8_4_;
    auVar39._12_4_ = fVar206 * local_a60._12_4_;
    auVar39._16_4_ = fVar96 * local_a60._16_4_;
    auVar39._20_4_ = fVar122 * local_a60._20_4_;
    auVar39._24_4_ = fVar123 * local_a60._24_4_;
    auVar39._28_4_ = auVar112._28_4_;
    auVar237 = vfmsub231ps_fma(auVar39,local_940,local_640);
    _local_860 = vpermps_avx2(_DAT_01fec480,local_840);
    auVar40._4_4_ = fVar125 * local_860._4_4_;
    auVar40._0_4_ = fVar124 * local_860._0_4_;
    auVar40._8_4_ = fVar126 * local_860._8_4_;
    auVar40._12_4_ = fVar127 * local_860._12_4_;
    auVar40._16_4_ = fVar142 * local_860._16_4_;
    auVar40._20_4_ = fVar162 * local_860._20_4_;
    auVar40._24_4_ = fVar163 * local_860._24_4_;
    auVar40._28_4_ = 0;
    auVar15 = local_a60;
    auVar5 = vfmsub231ps_fma(auVar40,local_a60,_local_660);
    auVar237 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar5._12_4_ * auVar5._12_4_,
                                                  CONCAT48(auVar5._8_4_ * auVar5._8_4_,
                                                           CONCAT44(auVar5._4_4_ * auVar5._4_4_,
                                                                    auVar5._0_4_ * auVar5._0_4_)))),
                               ZEXT1632(auVar237),ZEXT1632(auVar237));
    auVar16 = local_940;
    auVar226._0_4_ = fVar254 * local_940._0_4_;
    auVar226._4_4_ = fVar164 * local_940._4_4_;
    auVar226._8_4_ = fVar236 * local_940._8_4_;
    auVar226._12_4_ = fVar242 * local_940._12_4_;
    auVar226._16_4_ = fVar243 * local_940._16_4_;
    auVar226._20_4_ = fVar244 * local_940._20_4_;
    auVar226._24_4_ = fVar245 * local_940._24_4_;
    auVar226._28_4_ = 0;
    auVar17 = _local_860;
    auVar6 = stack0xfffffffffffff7b0;
    auVar5 = vfmsub231ps_fma(auVar226,_local_860,local_620);
    auVar237 = vfmadd231ps_fma(ZEXT1632(auVar237),ZEXT1632(auVar5),ZEXT1632(auVar5));
    auVar112 = vmaxps_avx(ZEXT1632(CONCAT412(auVar4._12_4_ * auVar107._12_4_,
                                             CONCAT48(auVar4._8_4_ * auVar107._8_4_,
                                                      CONCAT44(auVar4._4_4_ * auVar107._4_4_,
                                                               auVar4._0_4_ * auVar107._0_4_)))),
                          ZEXT1632(CONCAT412(auVar237._12_4_ * auVar107._12_4_,
                                             CONCAT48(auVar237._8_4_ * auVar107._8_4_,
                                                      CONCAT44(auVar237._4_4_ * auVar107._4_4_,
                                                               auVar237._0_4_ * auVar107._0_4_)))));
    local_8a0._0_4_ = auVar102._0_4_ + auVar195._0_4_;
    local_8a0._4_4_ = auVar102._4_4_ + auVar195._4_4_;
    local_8a0._8_4_ = auVar102._8_4_ + auVar195._8_4_;
    local_8a0._12_4_ = auVar102._12_4_ + auVar195._12_4_;
    local_8a0._16_4_ = auVar195._16_4_ + 0.0;
    local_8a0._20_4_ = auVar195._20_4_ + 0.0;
    local_8a0._24_4_ = auVar195._24_4_ + 0.0;
    local_8a0._28_4_ = 0;
    _local_880 = ZEXT1632(auVar102);
    auVar113 = vsubps_avx(_local_880,auVar195);
    local_6e0 = vpermps_avx2(_DAT_01fec480,auVar113);
    local_700 = vpermps_avx2(_DAT_01fec480,_local_880);
    auVar113 = vmaxps_avx(_local_880,local_8a0);
    auVar18 = local_700;
    auVar13 = vmaxps_avx(local_6e0,local_700);
    auVar221 = vrsqrtps_avx(ZEXT1632(auVar3));
    auVar113 = vmaxps_avx(auVar113,auVar13);
    fVar186 = auVar221._0_4_;
    fVar200 = auVar221._4_4_;
    fVar201 = auVar221._8_4_;
    fVar202 = auVar221._12_4_;
    fVar268 = auVar221._16_4_;
    fVar271 = auVar221._20_4_;
    fVar272 = auVar221._24_4_;
    auVar239._0_4_ = fVar186 * fVar186 * fVar186 * auVar3._0_4_ * -0.5;
    auVar239._4_4_ = fVar200 * fVar200 * fVar200 * auVar3._4_4_ * -0.5;
    auVar239._8_4_ = fVar201 * fVar201 * fVar201 * auVar3._8_4_ * -0.5;
    auVar239._12_4_ = fVar202 * fVar202 * fVar202 * auVar3._12_4_ * -0.5;
    auVar239._16_4_ = fVar268 * fVar268 * fVar268 * -0.0;
    auVar239._20_4_ = fVar271 * fVar271 * fVar271 * -0.0;
    auVar239._24_4_ = fVar272 * fVar272 * fVar272 * -0.0;
    auVar239._28_4_ = 0;
    auVar132._8_4_ = 0x3fc00000;
    auVar132._0_8_ = 0x3fc000003fc00000;
    auVar132._12_4_ = 0x3fc00000;
    auVar132._16_4_ = 0x3fc00000;
    auVar132._20_4_ = 0x3fc00000;
    auVar132._24_4_ = 0x3fc00000;
    auVar132._28_4_ = 0x3fc00000;
    auVar107 = vfmadd231ps_fma(auVar239,auVar132,auVar221);
    auVar241 = ZEXT1664(auVar107);
    fVar200 = auVar107._0_4_;
    fVar201 = auVar107._4_4_;
    auVar41._4_4_ = fVar164 * fVar201;
    auVar41._0_4_ = fVar254 * fVar200;
    fVar268 = auVar107._8_4_;
    auVar41._8_4_ = fVar236 * fVar268;
    fVar272 = auVar107._12_4_;
    auVar41._12_4_ = fVar242 * fVar272;
    auVar41._16_4_ = fVar243 * 0.0;
    auVar41._20_4_ = fVar244 * 0.0;
    auVar41._24_4_ = fVar245 * 0.0;
    auVar41._28_4_ = 0;
    auVar12._4_4_ = fStack_5dc;
    auVar12._0_4_ = local_5e0;
    auVar12._8_4_ = fStack_5d8;
    auVar12._12_4_ = fStack_5d4;
    auVar12._16_4_ = fStack_5d0;
    auVar12._20_4_ = fStack_5cc;
    auVar12._24_4_ = fStack_5c8;
    auVar12._28_4_ = fStack_5c4;
    auVar42._4_4_ = fStack_5dc * fVar204 * fVar201;
    auVar42._0_4_ = local_5e0 * fVar203 * fVar200;
    auVar42._8_4_ = fStack_5d8 * fVar205 * fVar268;
    auVar42._12_4_ = fStack_5d4 * fVar206 * fVar272;
    auVar42._16_4_ = fStack_5d0 * fVar96 * 0.0;
    auVar42._20_4_ = fStack_5cc * fVar122 * 0.0;
    auVar42._24_4_ = fStack_5c8 * fVar123 * 0.0;
    auVar42._28_4_ = local_620._28_4_;
    auVar107 = vfmadd231ps_fma(auVar42,auVar41,_local_580);
    auVar13 = vsubps_avx(ZEXT832(0) << 0x20,local_a80);
    fVar164 = auVar13._0_4_;
    auVar267._0_4_ = fVar164 * fVar203 * fVar200;
    fVar236 = auVar13._4_4_;
    auVar267._4_4_ = fVar236 * fVar204 * fVar201;
    fVar242 = auVar13._8_4_;
    auVar267._8_4_ = fVar242 * fVar205 * fVar268;
    fVar243 = auVar13._12_4_;
    auVar267._12_4_ = fVar243 * fVar206 * fVar272;
    fVar244 = auVar13._16_4_;
    auVar267._16_4_ = fVar244 * fVar96 * 0.0;
    fVar245 = auVar13._20_4_;
    auVar267._20_4_ = fVar245 * fVar122 * 0.0;
    fVar246 = auVar13._24_4_;
    auVar267._24_4_ = fVar246 * fVar123 * 0.0;
    auVar267._28_4_ = 0;
    auVar13 = vsubps_avx(ZEXT832(0) << 0x20,local_980);
    auVar102 = vfmadd231ps_fma(auVar267,auVar13,auVar41);
    auVar43._4_4_ = fVar125 * fVar201;
    auVar43._0_4_ = fVar124 * fVar200;
    auVar43._8_4_ = fVar126 * fVar268;
    auVar43._12_4_ = fVar127 * fVar272;
    auVar43._16_4_ = fVar142 * 0.0;
    auVar43._20_4_ = fVar162 * 0.0;
    auVar43._24_4_ = fVar163 * 0.0;
    auVar43._28_4_ = 0;
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar43,_local_780);
    auVar250 = ZEXT1664(auVar107);
    auVar221 = vsubps_avx(ZEXT832(0) << 0x20,auVar214);
    auVar253 = ZEXT3264(auVar221);
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar221,auVar43);
    auVar44._4_4_ = fStack_5dc * fVar236;
    auVar44._0_4_ = local_5e0 * fVar164;
    auVar44._8_4_ = fStack_5d8 * fVar242;
    auVar44._12_4_ = fStack_5d4 * fVar243;
    auVar44._16_4_ = fStack_5d0 * fVar244;
    auVar44._20_4_ = fStack_5cc * fVar245;
    auVar44._24_4_ = fStack_5c8 * fVar246;
    auVar44._28_4_ = 0;
    auVar3 = vfmadd231ps_fma(auVar44,_local_580,auVar13);
    auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),_local_780,auVar221);
    fVar186 = auVar102._0_4_;
    fVar254 = auVar107._0_4_;
    fVar202 = auVar102._4_4_;
    fVar96 = auVar107._4_4_;
    fVar271 = auVar102._8_4_;
    fVar122 = auVar107._8_4_;
    fVar203 = auVar102._12_4_;
    fVar123 = auVar107._12_4_;
    auVar14 = vsubps_avx(ZEXT1632(auVar3),
                         ZEXT1632(CONCAT412(fVar123 * fVar203,
                                            CONCAT48(fVar122 * fVar271,
                                                     CONCAT44(fVar96 * fVar202,fVar254 * fVar186))))
                        );
    auVar45._4_4_ = fVar236 * fVar236;
    auVar45._0_4_ = fVar164 * fVar164;
    auVar45._8_4_ = fVar242 * fVar242;
    auVar45._12_4_ = fVar243 * fVar243;
    auVar45._16_4_ = fVar244 * fVar244;
    auVar45._20_4_ = fVar245 * fVar245;
    auVar45._24_4_ = fVar246 * fVar246;
    auVar45._28_4_ = 0;
    auVar3 = vfmadd231ps_fma(auVar45,auVar13,auVar13);
    auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar221,auVar221);
    auVar46._28_4_ = uVar97;
    auVar46._0_28_ =
         ZEXT1628(CONCAT412(fVar203 * fVar203,
                            CONCAT48(fVar271 * fVar271,CONCAT44(fVar202 * fVar202,fVar186 * fVar186)
                                    )));
    local_8c0 = vsubps_avx(ZEXT1632(auVar3),auVar46);
    _local_8e0 = vsqrtps_avx(auVar112);
    fVar186 = (local_8e0._0_4_ + auVar113._0_4_) * 1.0000002;
    fVar202 = (local_8e0._4_4_ + auVar113._4_4_) * 1.0000002;
    fVar271 = (local_8e0._8_4_ + auVar113._8_4_) * 1.0000002;
    fVar203 = (local_8e0._12_4_ + auVar113._12_4_) * 1.0000002;
    fVar204 = (local_8e0._16_4_ + auVar113._16_4_) * 1.0000002;
    fVar205 = (local_8e0._20_4_ + auVar113._20_4_) * 1.0000002;
    fVar206 = (local_8e0._24_4_ + auVar113._24_4_) * 1.0000002;
    auVar47._4_4_ = fVar202 * fVar202;
    auVar47._0_4_ = fVar186 * fVar186;
    auVar47._8_4_ = fVar271 * fVar271;
    auVar47._12_4_ = fVar203 * fVar203;
    auVar47._16_4_ = fVar204 * fVar204;
    auVar47._20_4_ = fVar205 * fVar205;
    auVar47._24_4_ = fVar206 * fVar206;
    auVar47._28_4_ = local_8e0._28_4_ + auVar113._28_4_;
    local_5a0._0_4_ = auVar14._0_4_ + auVar14._0_4_;
    local_5a0._4_4_ = auVar14._4_4_ + auVar14._4_4_;
    local_5a0._8_4_ = auVar14._8_4_ + auVar14._8_4_;
    local_5a0._12_4_ = auVar14._12_4_ + auVar14._12_4_;
    local_5a0._16_4_ = auVar14._16_4_ + auVar14._16_4_;
    local_5a0._20_4_ = auVar14._20_4_ + auVar14._20_4_;
    local_5a0._24_4_ = auVar14._24_4_ + auVar14._24_4_;
    local_5a0._28_4_ = auVar14._28_4_ + auVar14._28_4_;
    auVar113 = vsubps_avx(local_8c0,auVar47);
    auVar232 = ZEXT1632(auVar107);
    local_960._28_4_ = 0x3f800002;
    local_960._0_28_ =
         ZEXT1628(CONCAT412(fVar123 * fVar123,
                            CONCAT48(fVar122 * fVar122,CONCAT44(fVar96 * fVar96,fVar254 * fVar254)))
                 );
    auVar14 = vsubps_avx(local_280,local_960);
    local_720._4_4_ = local_5a0._4_4_ * local_5a0._4_4_;
    local_720._0_4_ = local_5a0._0_4_ * local_5a0._0_4_;
    fStack_718 = local_5a0._8_4_ * local_5a0._8_4_;
    fStack_714 = local_5a0._12_4_ * local_5a0._12_4_;
    auStack_710._0_4_ = local_5a0._16_4_ * local_5a0._16_4_;
    auStack_710._4_4_ = local_5a0._20_4_ * local_5a0._20_4_;
    fStack_708 = local_5a0._24_4_ * local_5a0._24_4_;
    fStack_704 = (float)auVar112._28_4_;
    fVar202 = auVar14._0_4_;
    local_740._0_4_ = fVar202 * 4.0;
    fVar271 = auVar14._4_4_;
    local_740._4_4_ = fVar271 * 4.0;
    fVar203 = auVar14._8_4_;
    fStack_738 = fVar203 * 4.0;
    fVar204 = auVar14._12_4_;
    fStack_734 = fVar204 * 4.0;
    fVar205 = auVar14._16_4_;
    fStack_730 = fVar205 * 4.0;
    fVar206 = auVar14._20_4_;
    fStack_72c = fVar206 * 4.0;
    fVar254 = auVar14._24_4_;
    fStack_728 = fVar254 * 4.0;
    fStack_724 = 4.0;
    auVar48._4_4_ = auVar113._4_4_ * (float)local_740._4_4_;
    auVar48._0_4_ = auVar113._0_4_ * (float)local_740._0_4_;
    auVar48._8_4_ = auVar113._8_4_ * fStack_738;
    auVar48._12_4_ = auVar113._12_4_ * fStack_734;
    auVar48._16_4_ = auVar113._16_4_ * fStack_730;
    auVar48._20_4_ = auVar113._20_4_ * fStack_72c;
    auVar48._24_4_ = auVar113._24_4_ * fStack_728;
    auVar48._28_4_ = 0x40800000;
    auVar112 = vsubps_avx(_local_720,auVar48);
    local_5c0 = vcmpps_avx(auVar112,ZEXT432(0) << 0x20,5);
    auVar115 = ZEXT1632(auVar102);
    fVar186 = auVar14._28_4_;
    if ((((((((local_5c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (local_5c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (local_5c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(local_5c0 >> 0x7f,0) == '\0') &&
          (local_5c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(local_5c0 >> 0xbf,0) == '\0') &&
        (local_5c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
        -1 < local_5c0[0x1f]) {
      auVar181._8_4_ = 0x7f800000;
      auVar181._0_8_ = 0x7f8000007f800000;
      auVar181._12_4_ = 0x7f800000;
      auVar181._16_4_ = 0x7f800000;
      auVar181._20_4_ = 0x7f800000;
      auVar181._24_4_ = 0x7f800000;
      auVar181._28_4_ = 0x7f800000;
      auVar152._8_4_ = 0xff800000;
      auVar152._0_8_ = 0xff800000ff800000;
      auVar152._12_4_ = 0xff800000;
      auVar152._16_4_ = 0xff800000;
      auVar152._20_4_ = 0xff800000;
      auVar152._24_4_ = 0xff800000;
      auVar152._28_4_ = 0xff800000;
      auVar112 = _local_720;
LAB_01786a6b:
      auVar260 = ZEXT3264(auVar12);
    }
    else {
      auVar219 = vsqrtps_avx(auVar112);
      auVar255._0_4_ = fVar202 + fVar202;
      auVar255._4_4_ = fVar271 + fVar271;
      auVar255._8_4_ = fVar203 + fVar203;
      auVar255._12_4_ = fVar204 + fVar204;
      auVar255._16_4_ = fVar205 + fVar205;
      auVar255._20_4_ = fVar206 + fVar206;
      auVar255._24_4_ = fVar254 + fVar254;
      auVar255._28_4_ = fVar186 + fVar186;
      auVar198 = vrcpps_avx(auVar255);
      auVar151 = vcmpps_avx(auVar112,ZEXT832(0) << 0x20,5);
      auVar182._8_4_ = 0x3f800000;
      auVar182._0_8_ = 0x3f8000003f800000;
      auVar182._12_4_ = 0x3f800000;
      auVar182._16_4_ = 0x3f800000;
      auVar182._20_4_ = 0x3f800000;
      auVar182._24_4_ = 0x3f800000;
      auVar182._28_4_ = 0x3f800000;
      auVar107 = vfnmadd213ps_fma(auVar255,auVar198,auVar182);
      auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar198,auVar198);
      auVar183._0_4_ = (uint)local_5a0._0_4_ ^ local_600;
      auVar183._4_4_ = (uint)local_5a0._4_4_ ^ uStack_5fc;
      auVar183._8_4_ = (uint)local_5a0._8_4_ ^ uStack_5f8;
      auVar183._12_4_ = (uint)local_5a0._12_4_ ^ uStack_5f4;
      auVar183._16_4_ = (uint)local_5a0._16_4_ ^ (uint)fStack_5f0;
      auVar183._20_4_ = (uint)local_5a0._20_4_ ^ (uint)fStack_5ec;
      auVar183._24_4_ = (uint)local_5a0._24_4_ ^ (uint)fStack_5e8;
      auVar183._28_4_ = (uint)local_5a0._28_4_ ^ uStack_5e4;
      auVar112 = vsubps_avx(auVar183,auVar219);
      auVar49._4_4_ = auVar107._4_4_ * auVar112._4_4_;
      auVar49._0_4_ = auVar107._0_4_ * auVar112._0_4_;
      auVar49._8_4_ = auVar107._8_4_ * auVar112._8_4_;
      auVar49._12_4_ = auVar107._12_4_ * auVar112._12_4_;
      auVar49._16_4_ = auVar112._16_4_ * 0.0;
      auVar49._20_4_ = auVar112._20_4_ * 0.0;
      auVar49._24_4_ = auVar112._24_4_ * 0.0;
      auVar49._28_4_ = auVar112._28_4_;
      auVar112 = vsubps_avx(auVar219,local_5a0);
      auVar50._4_4_ = auVar107._4_4_ * auVar112._4_4_;
      auVar50._0_4_ = auVar107._0_4_ * auVar112._0_4_;
      auVar50._8_4_ = auVar107._8_4_ * auVar112._8_4_;
      auVar50._12_4_ = auVar107._12_4_ * auVar112._12_4_;
      auVar50._16_4_ = auVar112._16_4_ * 0.0;
      auVar50._20_4_ = auVar112._20_4_ * 0.0;
      auVar50._24_4_ = auVar112._24_4_ * 0.0;
      auVar50._28_4_ = auVar112._28_4_;
      auVar107 = vfmadd213ps_fma(auVar232,auVar49,auVar115);
      _local_680 = ZEXT1628(CONCAT412(fVar272 * auVar107._12_4_,
                                      CONCAT48(fVar268 * auVar107._8_4_,
                                               CONCAT44(fVar201 * auVar107._4_4_,
                                                        fVar200 * auVar107._0_4_))));
      fStack_664 = local_5a0._28_4_;
      auVar112 = vandps_avx(local_7a0,local_960);
      auVar112 = vmaxps_avx(local_4a0,auVar112);
      auVar51._4_4_ = auVar112._4_4_ * 1.9073486e-06;
      auVar51._0_4_ = auVar112._0_4_ * 1.9073486e-06;
      auVar51._8_4_ = auVar112._8_4_ * 1.9073486e-06;
      auVar51._12_4_ = auVar112._12_4_ * 1.9073486e-06;
      auVar51._16_4_ = auVar112._16_4_ * 1.9073486e-06;
      auVar51._20_4_ = auVar112._20_4_ * 1.9073486e-06;
      auVar51._24_4_ = auVar112._24_4_ * 1.9073486e-06;
      auVar51._28_4_ = auVar112._28_4_;
      auVar112 = vandps_avx(local_7a0,auVar14);
      auVar112 = vcmpps_avx(auVar112,auVar51,1);
      auVar107 = vfmadd213ps_fma(auVar232,auVar50,auVar115);
      auVar260 = ZEXT1664(auVar107);
      auVar133._8_4_ = 0x7f800000;
      auVar133._0_8_ = 0x7f8000007f800000;
      auVar133._12_4_ = 0x7f800000;
      auVar133._16_4_ = 0x7f800000;
      auVar133._20_4_ = 0x7f800000;
      auVar133._24_4_ = 0x7f800000;
      auVar133._28_4_ = 0x7f800000;
      auVar181 = vblendvps_avx(auVar133,auVar49,auVar151);
      _local_6a0 = ZEXT1628(CONCAT412(fVar272 * auVar107._12_4_,
                                      CONCAT48(fVar268 * auVar107._8_4_,
                                               CONCAT44(fVar201 * auVar107._4_4_,
                                                        fVar200 * auVar107._0_4_))));
      uStack_684 = 0x7f800000;
      auVar134._8_4_ = 0xff800000;
      auVar134._0_8_ = 0xff800000ff800000;
      auVar134._12_4_ = 0xff800000;
      auVar134._16_4_ = 0xff800000;
      auVar134._20_4_ = 0xff800000;
      auVar134._24_4_ = 0xff800000;
      auVar134._28_4_ = 0xff800000;
      auVar152 = vblendvps_avx(auVar134,auVar50,auVar151);
      auVar198 = auVar151 & auVar112;
      if ((((((((auVar198 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar198 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar198 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar198 >> 0x7f,0) != '\0') ||
            (auVar198 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar198 >> 0xbf,0) != '\0') ||
          (auVar198 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar198[0x1f] < '\0') {
        auVar198 = vandps_avx(auVar151,auVar112);
        auVar12 = vcmpps_avx(auVar113,ZEXT832(0) << 0x20,2);
        auVar140._8_4_ = 0xff800000;
        auVar140._0_8_ = 0xff800000ff800000;
        auVar140._12_4_ = 0xff800000;
        auVar140._16_4_ = 0xff800000;
        auVar140._20_4_ = 0xff800000;
        auVar140._24_4_ = 0xff800000;
        auVar140._28_4_ = 0xff800000;
        auVar215._8_4_ = 0x7f800000;
        auVar215._0_8_ = 0x7f8000007f800000;
        auVar215._12_4_ = 0x7f800000;
        auVar215._16_4_ = 0x7f800000;
        auVar215._20_4_ = 0x7f800000;
        auVar215._24_4_ = 0x7f800000;
        auVar215._28_4_ = 0x7f800000;
        auVar113 = vblendvps_avx(auVar215,auVar140,auVar12);
        auVar107 = vpackssdw_avx(auVar198._0_16_,auVar198._16_16_);
        auVar112 = vpmovsxwd_avx2(auVar107);
        auVar181 = vblendvps_avx(auVar181,auVar113,auVar112);
        auVar113 = vblendvps_avx(auVar140,auVar215,auVar12);
        auVar152 = vblendvps_avx(auVar152,auVar113,auVar112);
        auVar199._0_8_ = auVar198._0_8_ ^ 0xffffffffffffffff;
        auVar199._8_4_ = auVar198._8_4_ ^ 0xffffffff;
        auVar199._12_4_ = auVar198._12_4_ ^ 0xffffffff;
        auVar199._16_4_ = auVar198._16_4_ ^ 0xffffffff;
        auVar199._20_4_ = auVar198._20_4_ ^ 0xffffffff;
        auVar199._24_4_ = auVar198._24_4_ ^ 0xffffffff;
        auVar199._28_4_ = auVar198._28_4_ ^ 0xffffffff;
        auVar113 = vorps_avx(auVar12,auVar199);
        local_5c0 = vandps_avx(auVar151,auVar113);
        goto LAB_01786a6b;
      }
    }
    auVar223 = ZEXT3264(auVar112);
    auVar113 = local_2c0 & local_5c0;
    if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar113 >> 0x7f,0) != '\0') ||
          (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar113 >> 0xbf,0) != '\0') ||
        (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar113[0x1f] < '\0') {
      fVar96 = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_7c0._0_4_;
      auVar196._4_4_ = fVar96;
      auVar196._0_4_ = fVar96;
      auVar196._8_4_ = fVar96;
      auVar196._12_4_ = fVar96;
      auVar196._16_4_ = fVar96;
      auVar196._20_4_ = fVar96;
      auVar196._24_4_ = fVar96;
      auVar196._28_4_ = fVar96;
      auVar151 = vmaxps_avx(auVar196,auVar181);
      fVar96 = (ray->super_RayK<1>).tfar - (float)local_7c0._0_4_;
      auVar197._4_4_ = fVar96;
      auVar197._0_4_ = fVar96;
      auVar197._8_4_ = fVar96;
      auVar197._12_4_ = fVar96;
      auVar197._16_4_ = fVar96;
      auVar197._20_4_ = fVar96;
      auVar197._24_4_ = fVar96;
      auVar197._28_4_ = fVar96;
      auVar198 = vminps_avx(auVar197,auVar152);
      auVar68._4_4_ = local_a40._4_4_ * fVar236;
      auVar68._0_4_ = (float)local_a40._0_4_ * fVar164;
      auVar68._8_4_ = local_a40._8_4_ * fVar242;
      auVar68._12_4_ = local_a40._12_4_ * fVar243;
      auVar68._16_4_ = local_a40._16_4_ * fVar244;
      auVar68._20_4_ = local_a40._20_4_ * fVar245;
      auVar68._24_4_ = local_a40._24_4_ * fVar246;
      auVar68._28_4_ = auVar112._28_4_;
      auVar107 = vfmadd213ps_fma(auVar13,local_840,auVar68);
      auVar102 = vfmadd213ps_fma(auVar221,local_820,ZEXT1632(auVar107));
      auVar52._4_4_ = local_a40._4_4_ * fStack_5dc;
      auVar52._0_4_ = (float)local_a40._0_4_ * local_5e0;
      auVar52._8_4_ = local_a40._8_4_ * fStack_5d8;
      auVar52._12_4_ = local_a40._12_4_ * fStack_5d4;
      auVar52._16_4_ = local_a40._16_4_ * fStack_5d0;
      auVar52._20_4_ = local_a40._20_4_ * fStack_5cc;
      auVar52._24_4_ = local_a40._24_4_ * fStack_5c8;
      auVar52._28_4_ = auVar112._28_4_;
      auVar107 = vfmadd231ps_fma(auVar52,_local_580,local_840);
      auVar3 = vfmadd231ps_fma(ZEXT1632(auVar107),_local_780,local_820);
      auVar112 = vandps_avx(local_7a0,ZEXT1632(auVar3));
      auVar227._8_4_ = 0x219392ef;
      auVar227._0_8_ = 0x219392ef219392ef;
      auVar227._12_4_ = 0x219392ef;
      auVar227._16_4_ = 0x219392ef;
      auVar227._20_4_ = 0x219392ef;
      auVar227._24_4_ = 0x219392ef;
      auVar227._28_4_ = 0x219392ef;
      auVar113 = vcmpps_avx(auVar112,auVar227,1);
      auVar112 = vrcpps_avx(ZEXT1632(auVar3));
      auVar261._8_4_ = 0x3f800000;
      auVar261._0_8_ = 0x3f8000003f800000;
      auVar261._12_4_ = 0x3f800000;
      auVar261._16_4_ = 0x3f800000;
      auVar261._20_4_ = 0x3f800000;
      auVar261._24_4_ = 0x3f800000;
      auVar261._28_4_ = 0x3f800000;
      auVar221 = ZEXT1632(auVar3);
      auVar107 = vfnmadd213ps_fma(auVar112,auVar221,auVar261);
      auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar112,auVar112);
      auVar262._0_4_ = auVar3._0_4_ ^ local_600;
      auVar262._4_4_ = auVar3._4_4_ ^ uStack_5fc;
      auVar262._8_4_ = auVar3._8_4_ ^ uStack_5f8;
      auVar262._12_4_ = auVar3._12_4_ ^ uStack_5f4;
      auVar262._16_4_ = fStack_5f0;
      auVar262._20_4_ = fStack_5ec;
      auVar262._24_4_ = fStack_5e8;
      auVar262._28_4_ = uStack_5e4;
      auVar53._4_4_ = auVar107._4_4_ * (float)(auVar102._4_4_ ^ uStack_5fc);
      auVar53._0_4_ = auVar107._0_4_ * (float)(auVar102._0_4_ ^ local_600);
      auVar53._8_4_ = auVar107._8_4_ * (float)(auVar102._8_4_ ^ uStack_5f8);
      auVar53._12_4_ = auVar107._12_4_ * (float)(auVar102._12_4_ ^ uStack_5f4);
      auVar53._16_4_ = fStack_5f0 * 0.0;
      auVar53._20_4_ = fStack_5ec * 0.0;
      auVar53._24_4_ = fStack_5e8 * 0.0;
      auVar53._28_4_ = uStack_5e4;
      auVar112 = vcmpps_avx(auVar221,auVar262,1);
      auVar112 = vorps_avx(auVar113,auVar112);
      auVar256._8_4_ = 0xff800000;
      auVar256._0_8_ = 0xff800000ff800000;
      auVar256._12_4_ = 0xff800000;
      auVar256._16_4_ = 0xff800000;
      auVar256._20_4_ = 0xff800000;
      auVar256._24_4_ = 0xff800000;
      auVar256._28_4_ = 0xff800000;
      auVar112 = vblendvps_avx(auVar53,auVar256,auVar112);
      auVar13 = vmaxps_avx(auVar151,auVar112);
      auVar112 = vcmpps_avx(auVar221,auVar262,6);
      auVar112 = vorps_avx(auVar113,auVar112);
      auVar263._8_4_ = 0x7f800000;
      auVar263._0_8_ = 0x7f8000007f800000;
      auVar263._12_4_ = 0x7f800000;
      auVar263._16_4_ = 0x7f800000;
      auVar263._20_4_ = 0x7f800000;
      auVar263._24_4_ = 0x7f800000;
      auVar263._28_4_ = 0x7f800000;
      auVar112 = vblendvps_avx(auVar53,auVar263,auVar112);
      auVar221 = vminps_avx(auVar198,auVar112);
      fVar96 = (float)(local_600 ^ (uint)local_940._0_4_);
      fVar122 = (float)(uStack_5fc ^ (uint)local_940._4_4_);
      fVar123 = (float)(uStack_5f8 ^ (uint)local_940._8_4_);
      fVar124 = (float)(uStack_5f4 ^ (uint)local_940._12_4_);
      fVar125 = (float)((uint)fStack_5f0 ^ (uint)local_940._16_4_);
      fVar126 = (float)((uint)fStack_5ec ^ (uint)local_940._20_4_);
      fVar127 = (float)((uint)fStack_5e8 ^ (uint)local_940._24_4_);
      auVar222._0_4_ = local_600 ^ (uint)local_860._0_4_;
      auVar222._4_4_ = uStack_5fc ^ (uint)local_860._4_4_;
      auVar222._8_4_ = uStack_5f8 ^ (uint)local_860._8_4_;
      auVar222._12_4_ = uStack_5f4 ^ (uint)local_860._12_4_;
      auVar222._16_4_ = (uint)fStack_5f0 ^ (uint)local_860._16_4_;
      auVar222._20_4_ = (uint)fStack_5ec ^ (uint)local_860._20_4_;
      auVar222._24_4_ = (uint)fStack_5e8 ^ (uint)local_860._24_4_;
      auVar222._28_4_ = uStack_5e4 ^ uStack_844;
      auVar113 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar112 = vsubps_avx(auVar113,_local_900);
      auVar113 = vsubps_avx(auVar113,local_920);
      auVar54._4_4_ = auVar113._4_4_ * fVar122;
      auVar54._0_4_ = auVar113._0_4_ * fVar96;
      auVar54._8_4_ = auVar113._8_4_ * fVar123;
      auVar54._12_4_ = auVar113._12_4_ * fVar124;
      auVar54._16_4_ = auVar113._16_4_ * fVar125;
      auVar54._20_4_ = auVar113._20_4_ * fVar126;
      auVar54._24_4_ = auVar113._24_4_ * fVar127;
      auVar54._28_4_ = auVar113._28_4_;
      auVar107 = vfmadd231ps_fma(auVar54,auVar222,auVar112);
      auVar228._0_4_ = local_600 ^ (uint)local_a60._0_4_;
      auVar228._4_4_ = uStack_5fc ^ (uint)local_a60._4_4_;
      auVar228._8_4_ = uStack_5f8 ^ (uint)local_a60._8_4_;
      auVar228._12_4_ = uStack_5f4 ^ (uint)local_a60._12_4_;
      auVar228._16_4_ = (uint)fStack_5f0 ^ (uint)local_a60._16_4_;
      auVar228._20_4_ = (uint)fStack_5ec ^ (uint)local_a60._20_4_;
      auVar228._24_4_ = (uint)fStack_5e8 ^ (uint)local_a60._24_4_;
      auVar228._28_4_ = uStack_5e4 ^ local_a60._28_4_;
      auVar112 = vsubps_avx(ZEXT1232(ZEXT812(0)) << 0x20,_local_9e0);
      auVar102 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar228,auVar112);
      auVar55._4_4_ = fVar122 * fStack_5dc;
      auVar55._0_4_ = fVar96 * local_5e0;
      auVar55._8_4_ = fVar123 * fStack_5d8;
      auVar55._12_4_ = fVar124 * fStack_5d4;
      auVar55._16_4_ = fVar125 * fStack_5d0;
      auVar55._20_4_ = fVar126 * fStack_5cc;
      auVar55._24_4_ = fVar127 * fStack_5c8;
      auVar55._28_4_ = uStack_5e4 ^ local_940._28_4_;
      auVar107 = vfmadd231ps_fma(auVar55,_local_580,auVar222);
      auVar3 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar228,_local_780);
      auVar112 = vandps_avx(local_7a0,ZEXT1632(auVar3));
      auVar151 = vrcpps_avx(ZEXT1632(auVar3));
      auVar257._8_4_ = 0x219392ef;
      auVar257._0_8_ = 0x219392ef219392ef;
      auVar257._12_4_ = 0x219392ef;
      auVar257._16_4_ = 0x219392ef;
      auVar257._20_4_ = 0x219392ef;
      auVar257._24_4_ = 0x219392ef;
      auVar257._28_4_ = 0x219392ef;
      auVar113 = vcmpps_avx(auVar112,auVar257,1);
      auVar223 = ZEXT3264(auVar113);
      auVar153._8_4_ = 0x3f800000;
      auVar153._0_8_ = 0x3f8000003f800000;
      auVar153._12_4_ = 0x3f800000;
      auVar153._16_4_ = 0x3f800000;
      auVar153._20_4_ = 0x3f800000;
      auVar153._24_4_ = 0x3f800000;
      auVar153._28_4_ = 0x3f800000;
      auVar198 = ZEXT1632(auVar3);
      auVar107 = vfnmadd213ps_fma(auVar151,auVar198,auVar153);
      auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar151,auVar151);
      auVar229._0_4_ = auVar3._0_4_ ^ local_600;
      auVar229._4_4_ = auVar3._4_4_ ^ uStack_5fc;
      auVar229._8_4_ = auVar3._8_4_ ^ uStack_5f8;
      auVar229._12_4_ = auVar3._12_4_ ^ uStack_5f4;
      auVar229._16_4_ = fStack_5f0;
      auVar229._20_4_ = fStack_5ec;
      auVar229._24_4_ = fStack_5e8;
      auVar229._28_4_ = uStack_5e4;
      auVar56._4_4_ = auVar107._4_4_ * (float)(auVar102._4_4_ ^ uStack_5fc);
      auVar56._0_4_ = auVar107._0_4_ * (float)(auVar102._0_4_ ^ local_600);
      auVar56._8_4_ = auVar107._8_4_ * (float)(auVar102._8_4_ ^ uStack_5f8);
      auVar56._12_4_ = auVar107._12_4_ * (float)(auVar102._12_4_ ^ uStack_5f4);
      auVar56._16_4_ = fStack_5f0 * 0.0;
      auVar56._20_4_ = fStack_5ec * 0.0;
      auVar56._24_4_ = fStack_5e8 * 0.0;
      auVar56._28_4_ = uStack_5e4;
      auVar253 = ZEXT3264(auVar56);
      auVar112 = vcmpps_avx(auVar198,auVar229,1);
      auVar112 = vorps_avx(auVar112,auVar113);
      auVar135._8_4_ = 0xff800000;
      auVar135._0_8_ = 0xff800000ff800000;
      auVar135._12_4_ = 0xff800000;
      auVar135._16_4_ = 0xff800000;
      auVar135._20_4_ = 0xff800000;
      auVar135._24_4_ = 0xff800000;
      auVar135._28_4_ = 0xff800000;
      auVar112 = vblendvps_avx(auVar56,auVar135,auVar112);
      local_4e0 = vmaxps_avx(auVar13,auVar112);
      auVar260 = ZEXT3264(local_4e0);
      auVar112 = vcmpps_avx(auVar198,auVar229,6);
      auVar112 = vorps_avx(auVar113,auVar112);
      auVar113 = vblendvps_avx(auVar56,auVar263,auVar112);
      auVar112 = vandps_avx(local_2c0,local_5c0);
      local_500 = vminps_avx(auVar221,auVar113);
      auVar113 = vcmpps_avx(local_4e0,local_500,2);
      auVar13 = auVar112 & auVar113;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0x7f,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0xbf,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar13[0x1f] < '\0') {
        _local_9e0 = auVar14;
        auVar13 = vminps_avx(_local_680,auVar153);
        auVar151 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar13 = vmaxps_avx(auVar13,auVar151);
        auVar221 = vminps_avx(_local_6a0,auVar153);
        auVar221 = vmaxps_avx(auVar221,auVar151);
        fVar96 = DAT_01faff40._28_4_;
        auVar57._4_4_ = (auVar13._4_4_ + DAT_01faff40._4_4_) * 0.125;
        auVar57._0_4_ = (auVar13._0_4_ + (float)DAT_01faff40) * 0.125;
        auVar57._8_4_ = (auVar13._8_4_ + DAT_01faff40._8_4_) * 0.125;
        auVar57._12_4_ = (auVar13._12_4_ + DAT_01faff40._12_4_) * 0.125;
        auVar57._16_4_ = (auVar13._16_4_ + DAT_01faff40._16_4_) * 0.125;
        auVar57._20_4_ = (auVar13._20_4_ + DAT_01faff40._20_4_) * 0.125;
        auVar57._24_4_ = (auVar13._24_4_ + DAT_01faff40._24_4_) * 0.125;
        auVar57._28_4_ = auVar13._28_4_ + fVar96;
        auVar107 = vfmadd213ps_fma(auVar57,local_800,local_760);
        auVar58._4_4_ = (auVar221._4_4_ + DAT_01faff40._4_4_) * 0.125;
        auVar58._0_4_ = (auVar221._0_4_ + (float)DAT_01faff40) * 0.125;
        auVar58._8_4_ = (auVar221._8_4_ + DAT_01faff40._8_4_) * 0.125;
        auVar58._12_4_ = (auVar221._12_4_ + DAT_01faff40._12_4_) * 0.125;
        auVar58._16_4_ = (auVar221._16_4_ + DAT_01faff40._16_4_) * 0.125;
        auVar58._20_4_ = (auVar221._20_4_ + DAT_01faff40._20_4_) * 0.125;
        auVar58._24_4_ = (auVar221._24_4_ + DAT_01faff40._24_4_) * 0.125;
        auVar58._28_4_ = auVar221._28_4_ + fVar96;
        auVar102 = vfmadd213ps_fma(auVar58,local_800,local_760);
        auVar13 = vminps_avx(_local_880,local_8a0);
        auVar221 = vminps_avx(local_6e0,local_700);
        auVar13 = vminps_avx(auVar13,auVar221);
        auVar13 = vsubps_avx(auVar13,_local_8e0);
        auVar112 = vandps_avx(auVar113,auVar112);
        local_1a0 = ZEXT1632(auVar107);
        local_1c0 = ZEXT1632(auVar102);
        auVar59._4_4_ = auVar13._4_4_ * 0.99999976;
        auVar59._0_4_ = auVar13._0_4_ * 0.99999976;
        auVar59._8_4_ = auVar13._8_4_ * 0.99999976;
        auVar59._12_4_ = auVar13._12_4_ * 0.99999976;
        auVar59._16_4_ = auVar13._16_4_ * 0.99999976;
        auVar59._20_4_ = auVar13._20_4_ * 0.99999976;
        auVar59._24_4_ = auVar13._24_4_ * 0.99999976;
        auVar59._28_4_ = auVar13._28_4_;
        auVar113 = vmaxps_avx(ZEXT832(0) << 0x20,auVar59);
        auVar60._4_4_ = auVar113._4_4_ * auVar113._4_4_;
        auVar60._0_4_ = auVar113._0_4_ * auVar113._0_4_;
        auVar60._8_4_ = auVar113._8_4_ * auVar113._8_4_;
        auVar60._12_4_ = auVar113._12_4_ * auVar113._12_4_;
        auVar60._16_4_ = auVar113._16_4_ * auVar113._16_4_;
        auVar60._20_4_ = auVar113._20_4_ * auVar113._20_4_;
        auVar60._24_4_ = auVar113._24_4_ * auVar113._24_4_;
        auVar60._28_4_ = auVar113._28_4_;
        auVar13 = vsubps_avx(local_8c0,auVar60);
        auVar61._4_4_ = auVar13._4_4_ * (float)local_740._4_4_;
        auVar61._0_4_ = auVar13._0_4_ * (float)local_740._0_4_;
        auVar61._8_4_ = auVar13._8_4_ * fStack_738;
        auVar61._12_4_ = auVar13._12_4_ * fStack_734;
        auVar61._16_4_ = auVar13._16_4_ * fStack_730;
        auVar61._20_4_ = auVar13._20_4_ * fStack_72c;
        auVar61._24_4_ = auVar13._24_4_ * fStack_728;
        auVar61._28_4_ = auVar113._28_4_;
        auVar221 = vsubps_avx(_local_720,auVar61);
        auVar113 = vcmpps_avx(auVar221,ZEXT1232(ZEXT812(0)) << 0x20,5);
        _local_8e0 = local_4e0;
        auVar151 = _local_8e0;
        if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar113 >> 0x7f,0) == '\0') &&
              (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar113 >> 0xbf,0) == '\0') &&
            (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar113[0x1f]) {
          auVar115 = SUB6432(ZEXT864(0),0) << 0x20;
          local_620 = ZEXT832(0) << 0x20;
          local_640 = ZEXT832(0) << 0x20;
          _local_660 = ZEXT832(0) << 0x20;
          auVar198 = ZEXT832(0) << 0x40;
          auVar160 = ZEXT864(0) << 0x20;
          auVar223 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar230._8_4_ = 0xff800000;
          auVar230._0_8_ = 0xff800000ff800000;
          auVar230._12_4_ = 0xff800000;
          auVar230._16_4_ = 0xff800000;
          auVar230._20_4_ = 0xff800000;
          auVar230._24_4_ = 0xff800000;
          auVar230._28_4_ = 0xff800000;
        }
        else {
          _local_900 = auVar113;
          auVar219 = vsqrtps_avx(auVar221);
          auVar231._0_4_ = fVar202 + fVar202;
          auVar231._4_4_ = fVar271 + fVar271;
          auVar231._8_4_ = fVar203 + fVar203;
          auVar231._12_4_ = fVar204 + fVar204;
          auVar231._16_4_ = fVar205 + fVar205;
          auVar231._20_4_ = fVar206 + fVar206;
          auVar231._24_4_ = fVar254 + fVar254;
          auVar231._28_4_ = fVar186 + fVar186;
          auVar198 = vrcpps_avx(auVar231);
          auVar107 = vfnmadd213ps_fma(auVar231,auVar198,auVar153);
          auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar198,auVar198);
          auVar258._0_4_ = (uint)local_5a0._0_4_ ^ local_600;
          auVar258._4_4_ = (uint)local_5a0._4_4_ ^ uStack_5fc;
          auVar258._8_4_ = (uint)local_5a0._8_4_ ^ uStack_5f8;
          auVar258._12_4_ = (uint)local_5a0._12_4_ ^ uStack_5f4;
          auVar258._16_4_ = (uint)local_5a0._16_4_ ^ (uint)fStack_5f0;
          auVar258._20_4_ = (uint)local_5a0._20_4_ ^ (uint)fStack_5ec;
          auVar258._24_4_ = (uint)local_5a0._24_4_ ^ (uint)fStack_5e8;
          auVar258._28_4_ = (uint)local_5a0._28_4_ ^ uStack_5e4;
          auVar198 = vsubps_avx(auVar258,auVar219);
          auVar220 = vsubps_avx(auVar219,local_5a0);
          fVar186 = auVar198._0_4_ * auVar107._0_4_;
          fVar202 = auVar198._4_4_ * auVar107._4_4_;
          auVar62._4_4_ = fVar202;
          auVar62._0_4_ = fVar186;
          fVar271 = auVar198._8_4_ * auVar107._8_4_;
          auVar62._8_4_ = fVar271;
          fVar203 = auVar198._12_4_ * auVar107._12_4_;
          auVar62._12_4_ = fVar203;
          fVar204 = auVar198._16_4_ * 0.0;
          auVar62._16_4_ = fVar204;
          fVar205 = auVar198._20_4_ * 0.0;
          auVar62._20_4_ = fVar205;
          fVar206 = auVar198._24_4_ * 0.0;
          auVar62._24_4_ = fVar206;
          auVar62._28_4_ = auVar219._28_4_;
          fVar254 = auVar220._0_4_ * auVar107._0_4_;
          fVar122 = auVar220._4_4_ * auVar107._4_4_;
          auVar63._4_4_ = fVar122;
          auVar63._0_4_ = fVar254;
          fVar123 = auVar220._8_4_ * auVar107._8_4_;
          auVar63._8_4_ = fVar123;
          fVar124 = auVar220._12_4_ * auVar107._12_4_;
          auVar63._12_4_ = fVar124;
          fVar125 = auVar220._16_4_ * 0.0;
          auVar63._16_4_ = fVar125;
          fVar126 = auVar220._20_4_ * 0.0;
          auVar63._20_4_ = fVar126;
          fVar127 = auVar220._24_4_ * 0.0;
          auVar63._24_4_ = fVar127;
          auVar63._28_4_ = auVar198._28_4_;
          auVar107 = vfmadd213ps_fma(auVar232,auVar62,auVar115);
          auVar102 = vfmadd213ps_fma(auVar232,auVar63,auVar115);
          auVar232 = ZEXT1632(CONCAT412(fVar272 * auVar107._12_4_,
                                        CONCAT48(fVar268 * auVar107._8_4_,
                                                 CONCAT44(fVar201 * auVar107._4_4_,
                                                          fVar200 * auVar107._0_4_))));
          auVar115 = ZEXT1632(CONCAT412(fVar272 * auVar102._12_4_,
                                        CONCAT48(fVar268 * auVar102._8_4_,
                                                 CONCAT44(fVar201 * auVar102._4_4_,
                                                          fVar200 * auVar102._0_4_))));
          auVar107 = vfmadd213ps_fma(local_640,auVar232,auVar214);
          auVar102 = vfmadd213ps_fma(local_640,auVar115,auVar214);
          auVar3 = vfmadd213ps_fma(_local_660,auVar232,local_980);
          auVar4 = vfmadd213ps_fma(_local_660,auVar115,local_980);
          auVar237 = vfmadd213ps_fma(auVar232,local_620,local_a80);
          auVar5 = vfmadd213ps_fma(local_620,auVar115,local_a80);
          auVar64._4_4_ = (float)local_780._4_4_ * fVar202;
          auVar64._0_4_ = (float)local_780._0_4_ * fVar186;
          auVar64._8_4_ = fStack_778 * fVar271;
          auVar64._12_4_ = fStack_774 * fVar203;
          auVar64._16_4_ = fStack_770 * fVar204;
          auVar64._20_4_ = fStack_76c * fVar205;
          auVar64._24_4_ = fStack_768 * fVar206;
          auVar64._28_4_ = 0;
          auVar115 = vsubps_avx(auVar64,ZEXT1632(auVar107));
          auVar86._4_4_ = (float)local_580._4_4_ * fVar202;
          auVar86._0_4_ = (float)local_580._0_4_ * fVar186;
          auVar86._8_4_ = fStack_578 * fVar271;
          auVar86._12_4_ = fStack_574 * fVar203;
          auVar86._16_4_ = fStack_570 * fVar204;
          auVar86._20_4_ = fStack_56c * fVar205;
          auVar86._24_4_ = fStack_568 * fVar206;
          auVar86._28_4_ = fVar96;
          auVar198 = vsubps_avx(auVar86,ZEXT1632(auVar3));
          auVar154._0_4_ = local_5e0 * fVar186;
          auVar154._4_4_ = fStack_5dc * fVar202;
          auVar154._8_4_ = fStack_5d8 * fVar271;
          auVar154._12_4_ = fStack_5d4 * fVar203;
          auVar154._16_4_ = fStack_5d0 * fVar204;
          auVar154._20_4_ = fStack_5cc * fVar205;
          auVar154._24_4_ = fStack_5c8 * fVar206;
          auVar154._28_4_ = 0;
          auVar214 = vsubps_avx(auVar154,ZEXT1632(auVar237));
          auVar160 = ZEXT3264(auVar214);
          auVar233._0_4_ = (float)local_780._0_4_ * fVar254;
          auVar233._4_4_ = (float)local_780._4_4_ * fVar122;
          auVar233._8_4_ = fStack_778 * fVar123;
          auVar233._12_4_ = fStack_774 * fVar124;
          auVar233._16_4_ = fStack_770 * fVar125;
          auVar233._20_4_ = fStack_76c * fVar126;
          auVar233._24_4_ = fStack_768 * fVar127;
          auVar233._28_4_ = 0;
          local_620 = vsubps_avx(auVar233,ZEXT1632(auVar102));
          auVar65._4_4_ = (float)local_580._4_4_ * fVar122;
          auVar65._0_4_ = (float)local_580._0_4_ * fVar254;
          auVar65._8_4_ = fStack_578 * fVar123;
          auVar65._12_4_ = fStack_574 * fVar124;
          auVar65._16_4_ = fStack_570 * fVar125;
          auVar65._20_4_ = fStack_56c * fVar126;
          auVar65._24_4_ = fStack_568 * fVar127;
          auVar65._28_4_ = local_620._28_4_;
          local_640 = vsubps_avx(auVar65,ZEXT1632(auVar4));
          auVar66._4_4_ = fStack_5dc * fVar122;
          auVar66._0_4_ = local_5e0 * fVar254;
          auVar66._8_4_ = fStack_5d8 * fVar123;
          auVar66._12_4_ = fStack_5d4 * fVar124;
          auVar66._16_4_ = fStack_5d0 * fVar125;
          auVar66._20_4_ = fStack_5cc * fVar126;
          auVar66._24_4_ = fStack_5c8 * fVar127;
          auVar66._28_4_ = local_640._28_4_;
          _local_660 = vsubps_avx(auVar66,ZEXT1632(auVar5));
          auVar232 = vcmpps_avx(auVar221,_DAT_01faff00,5);
          auVar234._8_4_ = 0x7f800000;
          auVar234._0_8_ = 0x7f8000007f800000;
          auVar234._12_4_ = 0x7f800000;
          auVar234._16_4_ = 0x7f800000;
          auVar234._20_4_ = 0x7f800000;
          auVar234._24_4_ = 0x7f800000;
          auVar234._28_4_ = 0x7f800000;
          auVar214 = vblendvps_avx(auVar234,auVar62,auVar232);
          auVar223 = ZEXT3264(auVar214);
          auVar221 = vandps_avx(local_7a0,local_960);
          auVar221 = vmaxps_avx(local_4a0,auVar221);
          auVar67._4_4_ = auVar221._4_4_ * 1.9073486e-06;
          auVar67._0_4_ = auVar221._0_4_ * 1.9073486e-06;
          auVar67._8_4_ = auVar221._8_4_ * 1.9073486e-06;
          auVar67._12_4_ = auVar221._12_4_ * 1.9073486e-06;
          auVar67._16_4_ = auVar221._16_4_ * 1.9073486e-06;
          auVar67._20_4_ = auVar221._20_4_ * 1.9073486e-06;
          auVar67._24_4_ = auVar221._24_4_ * 1.9073486e-06;
          auVar67._28_4_ = auVar221._28_4_;
          auVar221 = vandps_avx(local_7a0,auVar14);
          auVar221 = vcmpps_avx(auVar221,auVar67,1);
          auVar235._8_4_ = 0xff800000;
          auVar235._0_8_ = 0xff800000ff800000;
          auVar235._12_4_ = 0xff800000;
          auVar235._16_4_ = 0xff800000;
          auVar235._20_4_ = 0xff800000;
          auVar235._24_4_ = 0xff800000;
          auVar235._28_4_ = 0xff800000;
          auVar230 = vblendvps_avx(auVar235,auVar63,auVar232);
          auVar14 = auVar232 & auVar221;
          if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0x7f,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar14 >> 0xbf,0) != '\0') ||
              (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar14[0x1f] < '\0') {
            auVar113 = vandps_avx(auVar221,auVar232);
            auVar221 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,2);
            auVar259._8_4_ = 0xff800000;
            auVar259._0_8_ = 0xff800000ff800000;
            auVar259._12_4_ = 0xff800000;
            auVar259._16_4_ = 0xff800000;
            auVar259._20_4_ = 0xff800000;
            auVar259._24_4_ = 0xff800000;
            auVar259._28_4_ = 0xff800000;
            auVar264._8_4_ = 0x7f800000;
            auVar264._0_8_ = 0x7f8000007f800000;
            auVar264._12_4_ = 0x7f800000;
            auVar264._16_4_ = 0x7f800000;
            auVar264._20_4_ = 0x7f800000;
            auVar264._24_4_ = 0x7f800000;
            auVar264._28_4_ = 0x7f800000;
            auVar13 = vblendvps_avx(auVar264,auVar259,auVar221);
            auVar107 = vpackssdw_avx(auVar113._0_16_,auVar113._16_16_);
            auVar14 = vpmovsxwd_avx2(auVar107);
            auVar13 = vblendvps_avx(auVar214,auVar13,auVar14);
            auVar223 = ZEXT3264(auVar13);
            auVar13 = vblendvps_avx(auVar259,auVar264,auVar221);
            auVar230 = vblendvps_avx(auVar230,auVar13,auVar14);
            auVar216._0_8_ = auVar113._0_8_ ^ 0xffffffffffffffff;
            auVar216._8_4_ = auVar113._8_4_ ^ 0xffffffff;
            auVar216._12_4_ = auVar113._12_4_ ^ 0xffffffff;
            auVar216._16_4_ = auVar113._16_4_ ^ 0xffffffff;
            auVar216._20_4_ = auVar113._20_4_ ^ 0xffffffff;
            auVar216._24_4_ = auVar113._24_4_ ^ 0xffffffff;
            auVar216._28_4_ = auVar113._28_4_ ^ 0xffffffff;
            auVar113 = vorps_avx(auVar221,auVar216);
            auVar113 = vandps_avx(auVar232,auVar113);
          }
        }
        auVar260 = ZEXT3264(local_4e0);
        uVar97 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
        auVar240._4_4_ = uVar97;
        auVar240._0_4_ = uVar97;
        auVar240._8_4_ = uVar97;
        auVar240._12_4_ = uVar97;
        auVar240._16_4_ = uVar97;
        auVar240._20_4_ = uVar97;
        auVar240._24_4_ = uVar97;
        auVar240._28_4_ = uVar97;
        auVar241 = ZEXT3264(auVar240);
        uVar97 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
        auVar252._4_4_ = uVar97;
        auVar252._0_4_ = uVar97;
        auVar252._8_4_ = uVar97;
        auVar252._12_4_ = uVar97;
        auVar252._16_4_ = uVar97;
        auVar252._20_4_ = uVar97;
        auVar252._24_4_ = uVar97;
        auVar252._28_4_ = uVar97;
        auVar253 = ZEXT3264(auVar252);
        fVar186 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_4c0 = vminps_avx(local_500,auVar223._0_32_);
        local_520 = vmaxps_avx(local_4e0,auVar230);
        auVar250 = ZEXT3264(local_520);
        auVar13 = vcmpps_avx(local_4e0,local_4c0,2);
        local_5a0 = vandps_avx(auVar13,auVar112);
        auVar13 = vcmpps_avx(local_520,local_500,2);
        auVar112 = vandps_avx(auVar13,auVar112);
        auVar13 = vorps_avx(auVar112,local_5a0);
        if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0x7f,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0xbf,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar13[0x1f] < '\0') {
          _local_680 = local_520;
          auVar13 = _local_680;
          local_300._0_8_ = auVar113._0_8_ ^ 0xffffffffffffffff;
          local_300._8_4_ = auVar113._8_4_ ^ 0xffffffff;
          local_300._12_4_ = auVar113._12_4_ ^ 0xffffffff;
          local_300._16_4_ = auVar113._16_4_ ^ 0xffffffff;
          local_300._20_4_ = auVar113._20_4_ ^ 0xffffffff;
          local_300._24_4_ = auVar113._24_4_ ^ 0xffffffff;
          local_300._28_4_ = auVar113._28_4_ ^ 0xffffffff;
          auVar161._0_4_ = fVar186 * auVar160._0_4_;
          auVar161._4_4_ = fVar186 * auVar160._4_4_;
          auVar161._8_4_ = fVar186 * auVar160._8_4_;
          auVar161._12_4_ = fVar186 * auVar160._12_4_;
          auVar161._16_4_ = fVar186 * auVar160._16_4_;
          auVar161._20_4_ = fVar186 * auVar160._20_4_;
          auVar161._28_36_ = auVar160._28_36_;
          auVar161._24_4_ = fVar186 * auVar160._24_4_;
          _local_6a0 = auVar252;
          auVar107 = vfmadd213ps_fma(auVar198,auVar252,auVar161._0_32_);
          auVar107 = vfmadd213ps_fma(auVar115,auVar240,ZEXT1632(auVar107));
          auVar113 = vandps_avx(ZEXT1632(auVar107),local_7a0);
          auVar136._8_4_ = 0x3e99999a;
          auVar136._0_8_ = 0x3e99999a3e99999a;
          auVar136._12_4_ = 0x3e99999a;
          auVar136._16_4_ = 0x3e99999a;
          auVar136._20_4_ = 0x3e99999a;
          auVar136._24_4_ = 0x3e99999a;
          auVar136._28_4_ = 0x3e99999a;
          auVar113 = vcmpps_avx(auVar113,auVar136,1);
          auVar113 = vorps_avx(auVar113,local_300);
          auVar137._8_4_ = 3;
          auVar137._0_8_ = 0x300000003;
          auVar137._12_4_ = 3;
          auVar137._16_4_ = 3;
          auVar137._20_4_ = 3;
          auVar137._24_4_ = 3;
          auVar137._28_4_ = 3;
          auVar155._8_4_ = 2;
          auVar155._0_8_ = 0x200000002;
          auVar155._12_4_ = 2;
          auVar155._16_4_ = 2;
          auVar155._20_4_ = 2;
          auVar155._24_4_ = 2;
          auVar155._28_4_ = 2;
          auVar113 = vblendvps_avx(auVar155,auVar137,auVar113);
          local_320._4_4_ = local_aec;
          local_320._0_4_ = local_aec;
          local_320._8_4_ = local_aec;
          local_320._12_4_ = local_aec;
          local_320._16_4_ = local_aec;
          local_320._20_4_ = local_aec;
          local_320._24_4_ = local_aec;
          local_320._28_4_ = local_aec;
          local_5c0 = vpcmpgtd_avx2(auVar113,local_320);
          local_560 = vpandn_avx2(local_5c0,local_5a0);
          auVar160 = ZEXT3264(local_560);
          auVar113 = local_5a0 & ~local_5c0;
          local_a60 = auVar15;
          local_940 = auVar16;
          if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar113 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar113 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar113 >> 0x7f,0) == '\0') &&
                (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar113 >> 0xbf,0) == '\0') &&
              (auVar113 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar113[0x1f]) {
            fVar200 = (ray->super_RayK<1>).tfar;
            auVar116._4_4_ = fVar200;
            auVar116._0_4_ = fVar200;
            auVar116._8_4_ = fVar200;
            auVar116._12_4_ = fVar200;
            auVar116._16_4_ = fVar200;
            auVar116._20_4_ = fVar200;
            auVar116._24_4_ = fVar200;
            auVar116._28_4_ = fVar200;
            local_680._0_4_ = local_520._0_4_;
            local_680._4_4_ = local_520._4_4_;
            fStack_678 = local_520._8_4_;
            fStack_674 = local_520._12_4_;
            fStack_670 = local_520._16_4_;
            fStack_66c = local_520._20_4_;
            fStack_668 = local_520._24_4_;
            fStack_664 = local_520._28_4_;
            local_8c0 = local_520;
            fVar201 = (float)local_680._0_4_;
            fVar204 = (float)local_680._4_4_;
            fVar205 = fStack_678;
            fVar206 = fStack_674;
            fVar254 = fStack_670;
            fVar96 = fStack_66c;
            fVar122 = fStack_668;
            fVar123 = fStack_664;
            fVar200 = fVar186;
            fVar202 = fVar186;
            fVar268 = fVar186;
            fVar271 = fVar186;
            fVar272 = fVar186;
            fVar203 = fVar186;
            _local_680 = auVar13;
            unique0x10013c4b = auVar6;
          }
          else {
            local_340 = auVar240;
            local_960._0_4_ = uVar207;
            auVar102 = vminps_avx(local_9f0,local_a10);
            auVar107 = vmaxps_avx(local_9f0,local_a10);
            auVar3 = vminps_avx(local_a00,_local_a20);
            auVar4 = vminps_avx(auVar102,auVar3);
            auVar102 = vmaxps_avx(local_a00,_local_a20);
            auVar3 = vmaxps_avx(auVar107,auVar102);
            auVar165._8_4_ = 0x7fffffff;
            auVar165._0_8_ = 0x7fffffff7fffffff;
            auVar165._12_4_ = 0x7fffffff;
            auVar107 = vandps_avx(auVar4,auVar165);
            local_760._0_16_ = auVar165;
            auVar102 = vandps_avx(auVar3,auVar165);
            auVar107 = vmaxps_avx(auVar107,auVar102);
            auVar102 = vmovshdup_avx(auVar107);
            auVar102 = vmaxss_avx(auVar102,auVar107);
            auVar107 = vshufpd_avx(auVar107,auVar107,1);
            auVar107 = vmaxss_avx(auVar107,auVar102);
            local_920._0_4_ = auVar107._0_4_ * 1.9073486e-06;
            auVar107 = vshufps_avx(auVar3,auVar3,0xff);
            _local_720 = auVar107;
            local_8e0._0_4_ = local_4e0._0_4_;
            local_8e0._4_4_ = local_4e0._4_4_;
            fStack_8d8 = local_4e0._8_4_;
            fStack_8d4 = local_4e0._12_4_;
            fStack_8d0 = local_4e0._16_4_;
            fStack_8cc = local_4e0._20_4_;
            fStack_8c8 = local_4e0._24_4_;
            fStack_8c4 = local_4e0._28_4_;
            local_740._4_4_ = (float)local_8e0._4_4_ + (float)local_7e0._4_4_;
            local_740._0_4_ = (float)local_8e0._0_4_ + (float)local_7e0._0_4_;
            fStack_738 = fStack_8d8 + fStack_7d8;
            fStack_734 = fStack_8d4 + fStack_7d4;
            fStack_730 = fStack_8d0 + fStack_7d0;
            fStack_72c = fStack_8cc + fStack_7cc;
            fStack_728 = fStack_8c8 + fStack_7c8;
            fStack_724 = fStack_8c4 + fStack_7c4;
            local_880._4_4_ = fVar186;
            local_880._0_4_ = fVar186;
            fStack_878 = fVar186;
            fStack_874 = fVar186;
            fStack_870 = fVar186;
            fStack_86c = fVar186;
            fStack_868 = fVar186;
            fStack_864 = fVar186;
            local_8a0 = auVar112;
            _local_8e0 = auVar151;
            _local_860 = auVar17;
            local_700 = auVar18;
            do {
              auVar117._8_4_ = 0x7f800000;
              auVar117._0_8_ = 0x7f8000007f800000;
              auVar117._12_4_ = 0x7f800000;
              auVar117._16_4_ = 0x7f800000;
              auVar117._20_4_ = 0x7f800000;
              auVar117._24_4_ = 0x7f800000;
              auVar117._28_4_ = 0x7f800000;
              auVar112 = auVar160._0_32_;
              auVar113 = vblendvps_avx(auVar117,_local_8e0,auVar112);
              auVar13 = vshufps_avx(auVar113,auVar113,0xb1);
              auVar13 = vminps_avx(auVar113,auVar13);
              auVar221 = vshufpd_avx(auVar13,auVar13,5);
              auVar13 = vminps_avx(auVar13,auVar221);
              auVar221 = vpermpd_avx2(auVar13,0x4e);
              auVar13 = vminps_avx(auVar13,auVar221);
              auVar113 = vcmpps_avx(auVar113,auVar13,0);
              auVar13 = auVar112 & auVar113;
              if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar13 >> 0x7f,0) != '\0') ||
                    (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0xbf,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar13[0x1f] < '\0') {
                auVar112 = vandps_avx(auVar113,auVar112);
              }
              uVar88 = vmovmskps_avx(auVar112);
              iVar19 = 0;
              for (; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000) {
                iVar19 = iVar19 + 1;
              }
              uVar89 = iVar19 << 2;
              *(undefined4 *)(local_560 + uVar89) = 0;
              aVar1 = (ray->super_RayK<1>).dir.field_0;
              _local_9e0 = (undefined1  [16])aVar1;
              auVar107 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
              uVar88 = *(uint *)(local_1a0 + uVar89);
              if (auVar107._0_4_ < 0.0) {
                local_a80._0_16_ = ZEXT416(*(uint *)(local_4e0 + uVar89));
                fVar186 = sqrtf(auVar107._0_4_);
                auVar107 = local_a80._0_16_;
              }
              else {
                auVar107 = vsqrtss_avx(auVar107,auVar107);
                fVar186 = auVar107._0_4_;
                auVar107 = ZEXT416(*(uint *)(local_4e0 + uVar89));
              }
              local_800._0_4_ = fVar186 * 1.9073486e-06;
              auVar107 = vinsertps_avx(auVar107,ZEXT416(uVar88),0x10);
              lVar91 = 5;
              do {
                auVar3 = vmovshdup_avx(auVar107);
                fVar200 = auVar3._0_4_;
                fVar271 = 1.0 - fVar200;
                local_820._0_16_ = ZEXT416((uint)fVar271);
                fVar202 = fVar271 * fVar271 * fVar271;
                fVar268 = fVar200 * fVar200;
                fVar201 = fVar200 * fVar268;
                auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar202),
                                         ZEXT416((uint)fVar201));
                fVar186 = fVar200 * fVar271;
                auVar237 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * fVar186 * 6.0)),
                                           ZEXT416((uint)(fVar271 * fVar186)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar271 * fVar186 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar200 * fVar186)));
                auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar201),
                                           ZEXT416((uint)fVar202));
                fVar200 = (auVar102._0_4_ + auVar5._0_4_) * 0.16666667;
                fVar201 = fVar201 * 0.16666667;
                auVar128._0_4_ = fVar201 * (float)local_a20._0_4_;
                auVar128._4_4_ = fVar201 * (float)local_a20._4_4_;
                auVar128._8_4_ = fVar201 * fStack_a18;
                auVar128._12_4_ = fVar201 * fStack_a14;
                auVar166._4_4_ = fVar200;
                auVar166._0_4_ = fVar200;
                auVar166._8_4_ = fVar200;
                auVar166._12_4_ = fVar200;
                auVar102 = vfmadd132ps_fma(auVar166,auVar128,local_a00);
                fVar200 = (auVar4._0_4_ + auVar237._0_4_) * 0.16666667;
                auVar129._4_4_ = fVar200;
                auVar129._0_4_ = fVar200;
                auVar129._8_4_ = fVar200;
                auVar129._12_4_ = fVar200;
                auVar102 = vfmadd132ps_fma(auVar129,auVar102,local_a10);
                fVar200 = auVar107._0_4_;
                auVar143._4_4_ = fVar200;
                auVar143._0_4_ = fVar200;
                auVar143._8_4_ = fVar200;
                auVar143._12_4_ = fVar200;
                auVar4 = vfmadd213ps_fma(auVar143,_local_9e0,_DAT_01f7aa10);
                fVar202 = fVar202 * 0.16666667;
                auVar101._4_4_ = fVar202;
                auVar101._0_4_ = fVar202;
                auVar101._8_4_ = fVar202;
                auVar101._12_4_ = fVar202;
                auVar102 = vfmadd132ps_fma(auVar101,auVar102,local_9f0);
                local_840._0_16_ = auVar102;
                auVar102 = vsubps_avx(auVar4,auVar102);
                _local_900 = auVar102;
                auVar102 = vdpps_avx(auVar102,auVar102,0x7f);
                local_a80._0_16_ = auVar102;
                if (auVar102._0_4_ < 0.0) {
                  local_980._0_16_ = auVar3;
                  local_820._0_16_ = ZEXT416((uint)fVar271);
                  local_a40._0_4_ = fVar268;
                  local_a60._0_4_ = fVar186;
                  auVar253._0_4_ = sqrtf(auVar102._0_4_);
                  auVar253._4_60_ = extraout_var;
                  auVar102 = auVar253._0_16_;
                  fVar186 = (float)local_a60._0_4_;
                  fVar268 = (float)local_a40._0_4_;
                  auVar3 = local_980._0_16_;
                }
                else {
                  auVar102 = vsqrtss_avx(auVar102,auVar102);
                }
                fVar201 = local_820._0_4_;
                auVar103._4_4_ = fVar201;
                auVar103._0_4_ = fVar201;
                auVar103._8_4_ = fVar201;
                auVar103._12_4_ = fVar201;
                auVar237 = vfnmsub213ss_fma(auVar3,auVar3,ZEXT416((uint)(fVar186 * 4.0)));
                auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar186 * 4.0)),local_820._0_16_,
                                         local_820._0_16_);
                fVar186 = fVar201 * -fVar201 * 0.5;
                fVar201 = auVar237._0_4_ * 0.5;
                fVar202 = auVar4._0_4_ * 0.5;
                fVar268 = fVar268 * 0.5;
                auVar210._0_4_ = (float)local_a20._0_4_ * fVar268;
                auVar210._4_4_ = (float)local_a20._4_4_ * fVar268;
                auVar210._8_4_ = fStack_a18 * fVar268;
                auVar210._12_4_ = fStack_a14 * fVar268;
                auVar167._4_4_ = fVar202;
                auVar167._0_4_ = fVar202;
                auVar167._8_4_ = fVar202;
                auVar167._12_4_ = fVar202;
                auVar4 = vfmadd213ps_fma(auVar167,local_a00,auVar210);
                auVar187._4_4_ = fVar201;
                auVar187._0_4_ = fVar201;
                auVar187._8_4_ = fVar201;
                auVar187._12_4_ = fVar201;
                auVar4 = vfmadd213ps_fma(auVar187,local_a10,auVar4);
                auVar248._4_4_ = fVar186;
                auVar248._0_4_ = fVar186;
                auVar248._8_4_ = fVar186;
                auVar248._12_4_ = fVar186;
                auVar5 = vfmadd213ps_fma(auVar248,local_9f0,auVar4);
                auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_820._0_16_,auVar3);
                auVar7 = vfmadd213ss_fma(auVar3,SUB6416(ZEXT464(0xc0000000),0),local_820._0_16_);
                auVar260 = ZEXT1664(auVar7);
                auVar3 = vshufps_avx(auVar107,auVar107,0x55);
                auVar168._0_4_ = (float)local_a20._0_4_ * auVar3._0_4_;
                auVar168._4_4_ = (float)local_a20._4_4_ * auVar3._4_4_;
                auVar168._8_4_ = fStack_a18 * auVar3._8_4_;
                auVar168._12_4_ = fStack_a14 * auVar3._12_4_;
                uVar207 = auVar7._0_4_;
                auVar188._4_4_ = uVar207;
                auVar188._0_4_ = uVar207;
                auVar188._8_4_ = uVar207;
                auVar188._12_4_ = uVar207;
                auVar3 = vfmadd213ps_fma(auVar188,local_a00,auVar168);
                auVar144._0_4_ = auVar4._0_4_;
                auVar144._4_4_ = auVar144._0_4_;
                auVar144._8_4_ = auVar144._0_4_;
                auVar144._12_4_ = auVar144._0_4_;
                auVar3 = vfmadd213ps_fma(auVar144,local_a10,auVar3);
                auVar6 = vfmadd231ps_fma(auVar3,local_9f0,auVar103);
                auVar4 = vdpps_avx(auVar5,auVar5,0x7f);
                auVar3 = vblendps_avx(auVar4,_DAT_01f7aa10,0xe);
                auVar237 = vrsqrtss_avx(auVar3,auVar3);
                fVar186 = auVar237._0_4_;
                fVar202 = auVar4._0_4_;
                fVar186 = fVar186 * 1.5 + fVar202 * -0.5 * fVar186 * fVar186 * fVar186;
                auVar237 = vdpps_avx(auVar5,auVar6,0x7f);
                auVar145._0_4_ = auVar6._0_4_ * fVar202;
                auVar145._4_4_ = auVar6._4_4_ * fVar202;
                auVar145._8_4_ = auVar6._8_4_ * fVar202;
                auVar145._12_4_ = auVar6._12_4_ * fVar202;
                fVar201 = auVar237._0_4_;
                auVar211._0_4_ = auVar5._0_4_ * fVar201;
                auVar211._4_4_ = auVar5._4_4_ * fVar201;
                fVar268 = auVar5._8_4_;
                auVar211._8_4_ = fVar268 * fVar201;
                fVar271 = auVar5._12_4_;
                auVar211._12_4_ = fVar271 * fVar201;
                auVar237 = vsubps_avx(auVar145,auVar211);
                auVar3 = vrcpss_avx(auVar3,auVar3);
                auVar6 = vfnmadd213ss_fma(auVar3,auVar4,ZEXT416(0x40000000));
                fVar201 = auVar3._0_4_ * auVar6._0_4_;
                auVar3 = vmaxss_avx(ZEXT416((uint)local_920._0_4_),
                                    ZEXT416((uint)(fVar200 * (float)local_800._0_4_)));
                local_980._0_4_ = auVar3._0_4_;
                auVar224._0_8_ = auVar5._0_8_ ^ 0x8000000080000000;
                auVar224._8_4_ = -fVar268;
                auVar224._12_4_ = -fVar271;
                local_860._0_4_ = fVar186 * auVar237._0_4_ * fVar201;
                local_860._4_4_ = fVar186 * auVar237._4_4_ * fVar201;
                local_860._8_4_ = fVar186 * auVar237._8_4_ * fVar201;
                local_860._12_4_ = fVar186 * auVar237._12_4_ * fVar201;
                local_940._0_4_ = auVar5._0_4_ * fVar186;
                local_940._4_4_ = auVar5._4_4_ * fVar186;
                local_940._8_4_ = fVar268 * fVar186;
                local_940._12_4_ = fVar271 * fVar186;
                local_820._0_16_ = auVar5;
                if (fVar202 < -fVar202) {
                  local_a40._0_4_ = auVar102._0_4_;
                  local_a60._0_16_ = auVar224;
                  auVar260 = ZEXT1664(auVar7);
                  fVar186 = sqrtf(fVar202);
                  auVar102 = ZEXT416((uint)local_a40._0_4_);
                  auVar224 = local_a60._0_16_;
                }
                else {
                  auVar3 = vsqrtss_avx(auVar4,auVar4);
                  fVar186 = auVar3._0_4_;
                }
                local_a40._0_16_ = vdpps_avx(_local_900,local_940._0_16_,0x7f);
                auVar5 = vfmadd213ss_fma(ZEXT416((uint)local_920._0_4_),auVar102,
                                         ZEXT416((uint)local_980._0_4_));
                auVar3 = vdpps_avx(auVar224,local_940._0_16_,0x7f);
                auVar4 = vdpps_avx(_local_900,local_860._0_16_,0x7f);
                auVar237 = vdpps_avx(_local_9e0,local_940._0_16_,0x7f);
                auVar102 = vfmadd213ss_fma(ZEXT416((uint)(auVar102._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_920._0_4_ / fVar186)),auVar5)
                ;
                local_a60._0_4_ = auVar102._0_4_;
                fVar186 = auVar3._0_4_ + auVar4._0_4_;
                auVar223 = ZEXT464((uint)fVar186);
                auVar104._0_4_ = local_a40._0_4_ * local_a40._0_4_;
                auVar104._4_4_ = local_a40._4_4_ * local_a40._4_4_;
                auVar104._8_4_ = local_a40._8_4_ * local_a40._8_4_;
                auVar104._12_4_ = local_a40._12_4_ * local_a40._12_4_;
                auVar102 = vdpps_avx(_local_900,auVar224,0x7f);
                auVar4 = vsubps_avx(local_a80._0_16_,auVar104);
                auVar3 = vrsqrtss_avx(auVar4,auVar4);
                fVar201 = auVar4._0_4_;
                fVar200 = auVar3._0_4_;
                fVar200 = fVar200 * 1.5 + fVar201 * -0.5 * fVar200 * fVar200 * fVar200;
                auVar3 = vdpps_avx(_local_900,_local_9e0,0x7f);
                local_940._0_16_ = ZEXT416((uint)fVar186);
                local_860._0_16_ =
                     vfnmadd231ss_fma(auVar102,local_a40._0_16_,ZEXT416((uint)fVar186));
                auVar102 = vfnmadd231ss_fma(auVar3,local_a40._0_16_,auVar237);
                if (fVar201 < 0.0) {
                  local_6e0._0_16_ = auVar237;
                  local_700._0_4_ = fVar200;
                  local_8c0._0_16_ = auVar102;
                  auVar223 = ZEXT464((uint)fVar186);
                  auVar260 = ZEXT1664(auVar260._0_16_);
                  fVar201 = sqrtf(fVar201);
                  fVar200 = (float)local_700._0_4_;
                  auVar102 = local_8c0._0_16_;
                  auVar237 = local_6e0._0_16_;
                }
                else {
                  auVar3 = vsqrtss_avx(auVar4,auVar4);
                  fVar201 = auVar3._0_4_;
                }
                auVar250 = ZEXT1664(local_a80._0_16_);
                auVar253 = ZEXT1664(local_820._0_16_);
                auVar3 = vpermilps_avx(local_840._0_16_,0xff);
                fVar201 = fVar201 - auVar3._0_4_;
                auVar4 = vshufps_avx(local_820._0_16_,local_820._0_16_,0xff);
                auVar3 = vfmsub213ss_fma(local_860._0_16_,ZEXT416((uint)fVar200),auVar4);
                auVar169._0_8_ = auVar237._0_8_ ^ 0x8000000080000000;
                auVar169._8_4_ = auVar237._8_4_ ^ 0x80000000;
                auVar169._12_4_ = auVar237._12_4_ ^ 0x80000000;
                auVar189._0_8_ = auVar3._0_8_ ^ 0x8000000080000000;
                auVar189._8_4_ = auVar3._8_4_ ^ 0x80000000;
                auVar189._12_4_ = auVar3._12_4_ ^ 0x80000000;
                auVar102 = ZEXT416((uint)(auVar102._0_4_ * fVar200));
                auVar3 = vfmsub231ss_fma(ZEXT416((uint)(auVar237._0_4_ * auVar3._0_4_)),
                                         local_940._0_16_,auVar102);
                auVar102 = vinsertps_avx(auVar189,auVar102,0x1c);
                uVar207 = auVar3._0_4_;
                auVar190._4_4_ = uVar207;
                auVar190._0_4_ = uVar207;
                auVar190._8_4_ = uVar207;
                auVar190._12_4_ = uVar207;
                auVar102 = vdivps_avx(auVar102,auVar190);
                auVar3 = vinsertps_avx(local_940._0_16_,auVar169,0x10);
                auVar3 = vdivps_avx(auVar3,auVar190);
                fVar186 = local_a40._0_4_;
                auVar146._0_4_ = fVar186 * auVar102._0_4_ + fVar201 * auVar3._0_4_;
                auVar146._4_4_ = fVar186 * auVar102._4_4_ + fVar201 * auVar3._4_4_;
                auVar146._8_4_ = fVar186 * auVar102._8_4_ + fVar201 * auVar3._8_4_;
                auVar146._12_4_ = fVar186 * auVar102._12_4_ + fVar201 * auVar3._12_4_;
                auVar107 = vsubps_avx(auVar107,auVar146);
                auVar102 = vandps_avx(local_a40._0_16_,local_760._0_16_);
                fVar200 = (float)local_880._4_4_;
                fVar202 = fStack_878;
                fVar268 = fStack_874;
                fVar271 = fStack_870;
                fVar272 = fStack_86c;
                fVar203 = fStack_868;
                fVar186 = (float)local_880._0_4_;
                if (auVar102._0_4_ < (float)local_a60._0_4_) {
                  auVar3 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a60._0_4_ +
                                                         (float)local_980._0_4_)),_local_720,
                                           ZEXT416(0x36000000));
                  auVar102 = vandps_avx(ZEXT416((uint)fVar201),local_760._0_16_);
                  if (auVar102._0_4_ < auVar3._0_4_) {
                    fVar201 = auVar107._0_4_ + (float)local_7c0._0_4_;
                    if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar201) &&
                       (fVar204 = (ray->super_RayK<1>).tfar, fVar201 <= fVar204)) {
                      auVar107 = vmovshdup_avx(auVar107);
                      fVar205 = auVar107._0_4_;
                      if ((0.0 <= fVar205) && (fVar205 <= 1.0)) {
                        auVar107 = vrsqrtss_avx(local_a80._0_16_,local_a80._0_16_);
                        fVar206 = auVar107._0_4_;
                        pGVar10 = (context->scene->geometries).items[uVar90].ptr;
                        if ((pGVar10->mask & (ray->super_RayK<1>).mask) != 0) {
                          fVar206 = fVar206 * 1.5 +
                                    local_a80._0_4_ * -0.5 * fVar206 * fVar206 * fVar206;
                          auVar170._0_4_ = fVar206 * (float)local_900._0_4_;
                          auVar170._4_4_ = fVar206 * (float)local_900._4_4_;
                          auVar170._8_4_ = fVar206 * fStack_8f8;
                          auVar170._12_4_ = fVar206 * fStack_8f4;
                          auVar4 = vfmadd213ps_fma(auVar4,auVar170,local_820._0_16_);
                          auVar107 = vshufps_avx(auVar170,auVar170,0xc9);
                          auVar102 = vshufps_avx(local_820._0_16_,local_820._0_16_,0xc9);
                          auVar171._0_4_ = auVar170._0_4_ * auVar102._0_4_;
                          auVar171._4_4_ = auVar170._4_4_ * auVar102._4_4_;
                          auVar171._8_4_ = auVar170._8_4_ * auVar102._8_4_;
                          auVar171._12_4_ = auVar170._12_4_ * auVar102._12_4_;
                          auVar3 = vfmsub231ps_fma(auVar171,local_820._0_16_,auVar107);
                          auVar107 = vshufps_avx(auVar3,auVar3,0xc9);
                          auVar102 = vshufps_avx(auVar4,auVar4,0xc9);
                          auVar3 = vshufps_avx(auVar3,auVar3,0xd2);
                          auVar105._0_4_ = auVar4._0_4_ * auVar3._0_4_;
                          auVar105._4_4_ = auVar4._4_4_ * auVar3._4_4_;
                          auVar105._8_4_ = auVar4._8_4_ * auVar3._8_4_;
                          auVar105._12_4_ = auVar4._12_4_ * auVar3._12_4_;
                          auVar107 = vfmsub231ps_fma(auVar105,auVar107,auVar102);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            (ray->super_RayK<1>).tfar = fVar201;
                            auVar102 = vshufps_avx(auVar107,auVar107,0xe9);
                            uVar98 = vmovlps_avx(auVar102);
                            *(undefined8 *)&(ray->Ng).field_0 = uVar98;
                            (ray->Ng).field_0.field_0.z = auVar107._0_4_;
                            ray->u = fVar205;
                            ray->v = 0.0;
                            ray->primID = local_960._0_4_;
                            ray->geomID = uVar90;
                            ray->instID[0] = context->user->instID[0];
                            ray->instPrimID[0] = context->user->instPrimID[0];
                          }
                          else {
                            auVar102 = vshufps_avx(auVar107,auVar107,0xe9);
                            local_9b0 = vmovlps_avx(auVar102);
                            local_9a8 = auVar107._0_4_;
                            local_9a4 = fVar205;
                            local_9a0 = 0;
                            local_99c = local_960._0_4_;
                            local_998 = uVar90;
                            local_994 = context->user->instID[0];
                            local_990 = context->user->instPrimID[0];
                            (ray->super_RayK<1>).tfar = fVar201;
                            local_6c0._0_4_ = 0xffffffff;
                            local_ab8.valid = (int *)local_6c0;
                            local_ab8.geometryUserPtr = pGVar10->userPtr;
                            local_ab8.context = context->user;
                            local_ab8.hit = (RTCHitN *)&local_9b0;
                            local_ab8.N = 1;
                            local_ab8.ray = (RTCRayN *)ray;
                            if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01787aab:
                              p_Var11 = context->args->filter;
                              if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar223 = ZEXT1664(auVar223._0_16_);
                                auVar250 = ZEXT1664(auVar250._0_16_);
                                auVar253 = ZEXT1664(auVar253._0_16_);
                                auVar260 = ZEXT1664(auVar260._0_16_);
                                (*p_Var11)(&local_ab8);
                                if (*local_ab8.valid == 0) goto LAB_01787b31;
                              }
                              (((Vec3f *)((long)local_ab8.ray + 0x30))->field_0).components[0] =
                                   *(float *)local_ab8.hit;
                              (((Vec3f *)((long)local_ab8.ray + 0x30))->field_0).field_0.y =
                                   *(float *)(local_ab8.hit + 4);
                              (((Vec3f *)((long)local_ab8.ray + 0x30))->field_0).field_0.z =
                                   *(float *)(local_ab8.hit + 8);
                              *(float *)((long)local_ab8.ray + 0x3c) =
                                   *(float *)(local_ab8.hit + 0xc);
                              *(float *)((long)local_ab8.ray + 0x40) =
                                   *(float *)(local_ab8.hit + 0x10);
                              *(float *)((long)local_ab8.ray + 0x44) =
                                   *(float *)(local_ab8.hit + 0x14);
                              *(float *)((long)local_ab8.ray + 0x48) =
                                   *(float *)(local_ab8.hit + 0x18);
                              *(float *)((long)local_ab8.ray + 0x4c) =
                                   *(float *)(local_ab8.hit + 0x1c);
                              *(float *)((long)local_ab8.ray + 0x50) =
                                   *(float *)(local_ab8.hit + 0x20);
                            }
                            else {
                              auVar223 = ZEXT1664(auVar223._0_16_);
                              auVar250 = ZEXT1664(local_a80._0_16_);
                              auVar253 = ZEXT1664(local_820._0_16_);
                              auVar260 = ZEXT1664(auVar260._0_16_);
                              (*pGVar10->intersectionFilterN)(&local_ab8);
                              if (*local_ab8.valid != 0) goto LAB_01787aab;
LAB_01787b31:
                              (ray->super_RayK<1>).tfar = fVar204;
                            }
                            fVar186 = (float)local_880._0_4_;
                            fVar200 = (float)local_880._4_4_;
                            fVar202 = fStack_878;
                            fVar268 = fStack_874;
                            fVar271 = fStack_870;
                            fVar272 = fStack_86c;
                            fVar203 = fStack_868;
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar91 = lVar91 + -1;
              } while (lVar91 != 0);
              auVar113 = local_560;
              fVar201 = (ray->super_RayK<1>).tfar;
              auVar116._4_4_ = fVar201;
              auVar116._0_4_ = fVar201;
              auVar116._8_4_ = fVar201;
              auVar116._12_4_ = fVar201;
              auVar116._16_4_ = fVar201;
              auVar116._20_4_ = fVar201;
              auVar116._24_4_ = fVar201;
              auVar116._28_4_ = fVar201;
              auVar112 = vcmpps_avx(_local_740,auVar116,2);
              local_560 = vandps_avx(auVar112,local_560);
              auVar160 = ZEXT3264(local_560);
              auVar113 = auVar113 & auVar112;
            } while ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar113 >> 0x7f,0) != '\0') ||
                       (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar113 >> 0xbf,0) != '\0') ||
                     (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar113[0x1f] < '\0');
            auVar160 = ZEXT3264(local_520);
            local_8c0 = local_520;
            auVar241 = ZEXT3264(local_340);
            uVar207 = local_960._0_4_;
            auVar112 = local_8a0;
            fVar201 = (float)local_680._0_4_;
            fVar204 = (float)local_680._4_4_;
            fVar205 = fStack_678;
            fVar206 = fStack_674;
            fVar254 = fStack_670;
            fVar96 = fStack_66c;
            fVar122 = fStack_668;
            fVar123 = fStack_664;
          }
          auVar141._0_4_ = fVar186 * (float)local_660._0_4_;
          auVar141._4_4_ = fVar200 * (float)local_660._4_4_;
          auVar141._8_4_ = fVar202 * fStack_658;
          auVar141._12_4_ = fVar268 * fStack_654;
          auVar141._16_4_ = fVar271 * fStack_650;
          auVar141._20_4_ = fVar272 * fStack_64c;
          auVar141._28_36_ = auVar160._28_36_;
          auVar141._24_4_ = fVar203 * fStack_648;
          auVar107 = vfmadd213ps_fma(local_640,_local_6a0,auVar141._0_32_);
          auVar107 = vfmadd213ps_fma(local_620,auVar241._0_32_,ZEXT1632(auVar107));
          auVar113 = vandps_avx(ZEXT1632(auVar107),local_7a0);
          auVar156._8_4_ = 0x3e99999a;
          auVar156._0_8_ = 0x3e99999a3e99999a;
          auVar156._12_4_ = 0x3e99999a;
          auVar156._16_4_ = 0x3e99999a;
          auVar156._20_4_ = 0x3e99999a;
          auVar156._24_4_ = 0x3e99999a;
          auVar156._28_4_ = 0x3e99999a;
          auVar113 = vcmpps_avx(auVar113,auVar156,1);
          auVar13 = vorps_avx(auVar113,local_300);
          auVar157._0_4_ = (float)local_7e0._0_4_ + fVar201;
          auVar157._4_4_ = (float)local_7e0._4_4_ + fVar204;
          auVar157._8_4_ = fStack_7d8 + fVar205;
          auVar157._12_4_ = fStack_7d4 + fVar206;
          auVar157._16_4_ = fStack_7d0 + fVar254;
          auVar157._20_4_ = fStack_7cc + fVar96;
          auVar157._24_4_ = fStack_7c8 + fVar122;
          auVar157._28_4_ = fStack_7c4 + fVar123;
          auVar113 = vcmpps_avx(auVar157,auVar116,2);
          _local_8e0 = vandps_avx(auVar113,auVar112);
          auVar158._8_4_ = 3;
          auVar158._0_8_ = 0x300000003;
          auVar158._12_4_ = 3;
          auVar158._16_4_ = 3;
          auVar158._20_4_ = 3;
          auVar158._24_4_ = 3;
          auVar158._28_4_ = 3;
          auVar184._8_4_ = 2;
          auVar184._0_8_ = 0x200000002;
          auVar184._12_4_ = 2;
          auVar184._16_4_ = 2;
          auVar184._20_4_ = 2;
          auVar184._24_4_ = 2;
          auVar184._28_4_ = 2;
          auVar112 = vblendvps_avx(auVar184,auVar158,auVar13);
          _local_740 = vpcmpgtd_avx2(auVar112,local_320);
          local_6c0 = vpandn_avx2(_local_740,_local_8e0);
          auVar112 = _local_8e0 & ~_local_740;
          if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar112 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar112 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar112 >> 0x7f,0) != '\0') ||
                (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar112 >> 0xbf,0) != '\0') ||
              (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar112[0x1f] < '\0') {
            local_960._0_4_ = uVar207;
            auVar102 = vminps_avx(local_9f0,local_a10);
            auVar107 = vmaxps_avx(local_9f0,local_a10);
            auVar3 = vminps_avx(local_a00,_local_a20);
            auVar4 = vminps_avx(auVar102,auVar3);
            auVar102 = vmaxps_avx(local_a00,_local_a20);
            auVar3 = vmaxps_avx(auVar107,auVar102);
            local_860._8_4_ = NAN;
            local_860._0_8_ = 0x7fffffff7fffffff;
            local_860._12_4_ = NAN;
            auVar107 = vandps_avx(auVar4,local_860._0_16_);
            auVar102 = vandps_avx(auVar3,local_860._0_16_);
            auVar107 = vmaxps_avx(auVar107,auVar102);
            auVar102 = vmovshdup_avx(auVar107);
            auVar102 = vmaxss_avx(auVar102,auVar107);
            auVar107 = vshufpd_avx(auVar107,auVar107,1);
            auVar107 = vmaxss_avx(auVar107,auVar102);
            local_900._0_4_ = auVar107._0_4_ * 1.9073486e-06;
            local_700._0_16_ = vshufps_avx(auVar3,auVar3,0xff);
            local_720._4_4_ = (float)local_7e0._4_4_ + local_520._4_4_;
            local_720._0_4_ = (float)local_7e0._0_4_ + local_520._0_4_;
            fStack_718 = fStack_7d8 + local_520._8_4_;
            fStack_714 = fStack_7d4 + local_520._12_4_;
            auStack_710._0_4_ = fStack_7d0 + local_520._16_4_;
            auStack_710._4_4_ = fStack_7cc + local_520._20_4_;
            fStack_708 = fStack_7c8 + local_520._24_4_;
            fStack_704 = fStack_7c4 + local_520._28_4_;
            local_8c0 = local_520;
            do {
              auVar118._8_4_ = 0x7f800000;
              auVar118._0_8_ = 0x7f8000007f800000;
              auVar118._12_4_ = 0x7f800000;
              auVar118._16_4_ = 0x7f800000;
              auVar118._20_4_ = 0x7f800000;
              auVar118._24_4_ = 0x7f800000;
              auVar118._28_4_ = 0x7f800000;
              auVar112 = vblendvps_avx(auVar118,local_8c0,local_6c0);
              auVar113 = vshufps_avx(auVar112,auVar112,0xb1);
              auVar113 = vminps_avx(auVar112,auVar113);
              auVar13 = vshufpd_avx(auVar113,auVar113,5);
              auVar113 = vminps_avx(auVar113,auVar13);
              auVar13 = vpermpd_avx2(auVar113,0x4e);
              auVar113 = vminps_avx(auVar113,auVar13);
              auVar113 = vcmpps_avx(auVar112,auVar113,0);
              auVar13 = local_6c0 & auVar113;
              auVar112 = local_6c0;
              if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar13 >> 0x7f,0) != '\0') ||
                    (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0xbf,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar13[0x1f] < '\0') {
                auVar112 = vandps_avx(auVar113,local_6c0);
              }
              uVar88 = vmovmskps_avx(auVar112);
              iVar19 = 0;
              for (; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000) {
                iVar19 = iVar19 + 1;
              }
              uVar89 = iVar19 << 2;
              *(undefined4 *)(local_6c0 + uVar89) = 0;
              aVar1 = (ray->super_RayK<1>).dir.field_0;
              local_980._0_16_ = (undefined1  [16])aVar1;
              auVar107 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
              uVar88 = *(uint *)(local_1c0 + uVar89);
              if (auVar107._0_4_ < 0.0) {
                local_a80._0_16_ = ZEXT416(*(uint *)(local_500 + uVar89));
                fVar186 = sqrtf(auVar107._0_4_);
                auVar107 = local_a80._0_16_;
              }
              else {
                auVar107 = vsqrtss_avx(auVar107,auVar107);
                fVar186 = auVar107._0_4_;
                auVar107 = ZEXT416(*(uint *)(local_500 + uVar89));
              }
              local_760._0_4_ = fVar186 * 1.9073486e-06;
              auVar107 = vinsertps_avx(auVar107,ZEXT416(uVar88),0x10);
              auVar241 = ZEXT1664(auVar107);
              lVar91 = 5;
              do {
                auVar237 = auVar241._0_16_;
                local_920._0_16_ = vmovshdup_avx(auVar237);
                fVar200 = local_920._0_4_;
                fVar271 = 1.0 - fVar200;
                fVar202 = fVar271 * fVar271 * fVar271;
                fVar268 = fVar200 * fVar200;
                fVar201 = fVar200 * fVar268;
                auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar202),
                                           ZEXT416((uint)fVar201));
                fVar186 = fVar200 * fVar271;
                auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * fVar186 * 6.0)),
                                         ZEXT416((uint)(fVar271 * fVar186)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar271 * fVar186 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar200 * fVar186)));
                auVar107 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar201),
                                           ZEXT416((uint)fVar202));
                fVar200 = (auVar107._0_4_ + auVar4._0_4_) * 0.16666667;
                fVar201 = fVar201 * 0.16666667;
                auVar130._0_4_ = fVar201 * (float)local_a20._0_4_;
                auVar130._4_4_ = fVar201 * (float)local_a20._4_4_;
                auVar130._8_4_ = fVar201 * fStack_a18;
                auVar130._12_4_ = fVar201 * fStack_a14;
                auVar172._4_4_ = fVar200;
                auVar172._0_4_ = fVar200;
                auVar172._8_4_ = fVar200;
                auVar172._12_4_ = fVar200;
                auVar107 = vfmadd132ps_fma(auVar172,auVar130,local_a00);
                fVar200 = (auVar102._0_4_ + auVar3._0_4_) * 0.16666667;
                auVar131._4_4_ = fVar200;
                auVar131._0_4_ = fVar200;
                auVar131._8_4_ = fVar200;
                auVar131._12_4_ = fVar200;
                auVar107 = vfmadd132ps_fma(auVar131,auVar107,local_a10);
                fVar200 = auVar241._0_4_;
                auVar147._4_4_ = fVar200;
                auVar147._0_4_ = fVar200;
                auVar147._8_4_ = fVar200;
                auVar147._12_4_ = fVar200;
                auVar102 = vfmadd213ps_fma(auVar147,local_980._0_16_,_DAT_01f7aa10);
                fVar202 = fVar202 * 0.16666667;
                auVar106._4_4_ = fVar202;
                auVar106._0_4_ = fVar202;
                auVar106._8_4_ = fVar202;
                auVar106._12_4_ = fVar202;
                auVar107 = vfmadd132ps_fma(auVar106,auVar107,local_9f0);
                local_820._0_16_ = auVar107;
                auVar107 = vsubps_avx(auVar102,auVar107);
                _local_9e0 = auVar107;
                auVar107 = vdpps_avx(auVar107,auVar107,0x7f);
                local_a80._0_16_ = auVar107;
                if (auVar107._0_4_ < 0.0) {
                  local_840._0_16_ = ZEXT416((uint)fVar271);
                  local_a40._0_4_ = fVar268;
                  local_a60._0_4_ = fVar186;
                  auVar223._0_4_ = sqrtf(auVar107._0_4_);
                  auVar223._4_60_ = extraout_var_00;
                  auVar107 = auVar223._0_16_;
                  fVar268 = (float)local_a40._0_4_;
                  auVar102 = local_840._0_16_;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar107,auVar107);
                  local_a60._0_4_ = fVar186;
                  auVar102 = ZEXT416((uint)fVar271);
                }
                fVar186 = auVar102._0_4_;
                auVar108._4_4_ = fVar186;
                auVar108._0_4_ = fVar186;
                auVar108._8_4_ = fVar186;
                auVar108._12_4_ = fVar186;
                auVar4 = vfnmsub213ss_fma(local_920._0_16_,local_920._0_16_,
                                          ZEXT416((uint)((float)local_a60._0_4_ * 4.0)));
                auVar3 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a60._0_4_ * 4.0)),auVar102,
                                         auVar102);
                fVar186 = fVar186 * -fVar186 * 0.5;
                fVar201 = auVar4._0_4_ * 0.5;
                fVar202 = auVar3._0_4_ * 0.5;
                fVar268 = fVar268 * 0.5;
                auVar212._0_4_ = (float)local_a20._0_4_ * fVar268;
                auVar212._4_4_ = (float)local_a20._4_4_ * fVar268;
                auVar212._8_4_ = fStack_a18 * fVar268;
                auVar212._12_4_ = fStack_a14 * fVar268;
                auVar173._4_4_ = fVar202;
                auVar173._0_4_ = fVar202;
                auVar173._8_4_ = fVar202;
                auVar173._12_4_ = fVar202;
                auVar3 = vfmadd213ps_fma(auVar173,local_a00,auVar212);
                auVar191._4_4_ = fVar201;
                auVar191._0_4_ = fVar201;
                auVar191._8_4_ = fVar201;
                auVar191._12_4_ = fVar201;
                auVar3 = vfmadd213ps_fma(auVar191,local_a10,auVar3);
                auVar249._4_4_ = fVar186;
                auVar249._0_4_ = fVar186;
                auVar249._8_4_ = fVar186;
                auVar249._12_4_ = fVar186;
                auVar5 = vfmadd213ps_fma(auVar249,local_9f0,auVar3);
                auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar102,local_920._0_16_);
                auVar7 = vfmadd213ss_fma(local_920._0_16_,SUB6416(ZEXT464(0xc0000000),0),auVar102);
                auVar260 = ZEXT1664(auVar7);
                auVar102 = vshufps_avx(auVar237,auVar237,0x55);
                auVar174._0_4_ = (float)local_a20._0_4_ * auVar102._0_4_;
                auVar174._4_4_ = (float)local_a20._4_4_ * auVar102._4_4_;
                auVar174._8_4_ = fStack_a18 * auVar102._8_4_;
                auVar174._12_4_ = fStack_a14 * auVar102._12_4_;
                uVar207 = auVar7._0_4_;
                auVar192._4_4_ = uVar207;
                auVar192._0_4_ = uVar207;
                auVar192._8_4_ = uVar207;
                auVar192._12_4_ = uVar207;
                auVar102 = vfmadd213ps_fma(auVar192,local_a00,auVar174);
                auVar148._0_4_ = auVar3._0_4_;
                auVar148._4_4_ = auVar148._0_4_;
                auVar148._8_4_ = auVar148._0_4_;
                auVar148._12_4_ = auVar148._0_4_;
                auVar102 = vfmadd213ps_fma(auVar148,local_a10,auVar102);
                auVar6 = vfmadd231ps_fma(auVar102,local_9f0,auVar108);
                auVar3 = vdpps_avx(auVar5,auVar5,0x7f);
                auVar102 = vblendps_avx(auVar3,_DAT_01f7aa10,0xe);
                auVar4 = vrsqrtss_avx(auVar102,auVar102);
                fVar186 = auVar4._0_4_;
                fVar202 = auVar3._0_4_;
                fVar186 = fVar186 * 1.5 + fVar202 * -0.5 * fVar186 * fVar186 * fVar186;
                auVar4 = vdpps_avx(auVar5,auVar6,0x7f);
                auVar149._0_4_ = auVar6._0_4_ * fVar202;
                auVar149._4_4_ = auVar6._4_4_ * fVar202;
                auVar149._8_4_ = auVar6._8_4_ * fVar202;
                auVar149._12_4_ = auVar6._12_4_ * fVar202;
                fVar201 = auVar4._0_4_;
                auVar213._0_4_ = auVar5._0_4_ * fVar201;
                auVar213._4_4_ = auVar5._4_4_ * fVar201;
                fVar268 = auVar5._8_4_;
                auVar213._8_4_ = fVar268 * fVar201;
                fVar271 = auVar5._12_4_;
                auVar213._12_4_ = fVar271 * fVar201;
                auVar4 = vsubps_avx(auVar149,auVar213);
                auVar102 = vrcpss_avx(auVar102,auVar102);
                auVar6 = vfnmadd213ss_fma(auVar102,auVar3,ZEXT416(0x40000000));
                fVar201 = auVar102._0_4_ * auVar6._0_4_;
                auVar102 = vmaxss_avx(ZEXT416((uint)local_900._0_4_),
                                      ZEXT416((uint)(fVar200 * (float)local_760._0_4_)));
                local_a60._0_8_ = auVar5._0_8_ ^ 0x8000000080000000;
                local_a60._8_4_ = -fVar268;
                local_a60._12_4_ = -fVar271;
                auVar175._0_4_ = fVar186 * auVar4._0_4_ * fVar201;
                auVar175._4_4_ = fVar186 * auVar4._4_4_ * fVar201;
                auVar175._8_4_ = fVar186 * auVar4._8_4_ * fVar201;
                auVar175._12_4_ = fVar186 * auVar4._12_4_ * fVar201;
                local_940._0_4_ = auVar5._0_4_ * fVar186;
                local_940._4_4_ = auVar5._4_4_ * fVar186;
                local_940._8_4_ = fVar268 * fVar186;
                local_940._12_4_ = fVar271 * fVar186;
                local_920._0_16_ = auVar5;
                local_840._0_4_ = auVar102._0_4_;
                if (fVar202 < -fVar202) {
                  local_a40._0_4_ = auVar107._0_4_;
                  local_800._0_16_ = auVar175;
                  auVar260 = ZEXT1664(auVar7);
                  fVar186 = sqrtf(fVar202);
                  auVar102 = ZEXT416((uint)local_840._0_4_);
                  auVar107 = ZEXT416((uint)local_a40._0_4_);
                  auVar175 = local_800._0_16_;
                }
                else {
                  auVar3 = vsqrtss_avx(auVar3,auVar3);
                  fVar186 = auVar3._0_4_;
                }
                local_a40._0_16_ = vdpps_avx(_local_9e0,local_940._0_16_,0x7f);
                auVar223 = ZEXT1664(local_a40._0_16_);
                auVar6 = vfmadd213ss_fma(ZEXT416((uint)local_900._0_4_),auVar107,auVar102);
                auVar3 = vdpps_avx(local_a60._0_16_,local_940._0_16_,0x7f);
                auVar4 = vdpps_avx(_local_9e0,auVar175,0x7f);
                auVar5 = vdpps_avx(local_980._0_16_,local_940._0_16_,0x7f);
                auVar8 = vfmadd213ss_fma(ZEXT416((uint)(auVar107._0_4_ + 1.0)),
                                         ZEXT416((uint)((float)local_900._0_4_ / fVar186)),auVar6);
                auVar253 = ZEXT1664(auVar8);
                auVar109._0_4_ = local_a40._0_4_ * local_a40._0_4_;
                auVar109._4_4_ = local_a40._4_4_ * local_a40._4_4_;
                auVar109._8_4_ = local_a40._8_4_ * local_a40._8_4_;
                auVar109._12_4_ = local_a40._12_4_ * local_a40._12_4_;
                auVar107 = vdpps_avx(_local_9e0,local_a60._0_16_,0x7f);
                auVar7 = vsubps_avx(local_a80._0_16_,auVar109);
                auVar6 = vrsqrtss_avx(auVar7,auVar7);
                fVar200 = auVar7._0_4_;
                fVar186 = auVar6._0_4_;
                fVar186 = fVar186 * 1.5 + fVar200 * -0.5 * fVar186 * fVar186 * fVar186;
                auVar6 = vdpps_avx(_local_9e0,local_980._0_16_,0x7f);
                local_a60._0_16_ = ZEXT416((uint)(auVar3._0_4_ + auVar4._0_4_));
                local_940._0_16_ = vfnmadd231ss_fma(auVar107,local_a40._0_16_,local_a60._0_16_);
                auVar107 = vfnmadd231ss_fma(auVar6,local_a40._0_16_,auVar5);
                if (fVar200 < 0.0) {
                  local_800._0_4_ = auVar8._0_4_;
                  _local_880 = auVar5;
                  local_8a0._0_4_ = fVar186;
                  local_6e0._0_16_ = auVar107;
                  auVar223 = ZEXT1664(local_a40._0_16_);
                  auVar260 = ZEXT1664(auVar260._0_16_);
                  fVar200 = sqrtf(fVar200);
                  auVar253 = ZEXT464((uint)local_800._0_4_);
                  auVar102 = ZEXT416((uint)local_840._0_4_);
                  fVar186 = (float)local_8a0._0_4_;
                  auVar107 = local_6e0._0_16_;
                  auVar5 = _local_880;
                }
                else {
                  auVar3 = vsqrtss_avx(auVar7,auVar7);
                  fVar200 = auVar3._0_4_;
                }
                auVar250 = ZEXT1664(local_920._0_16_);
                auVar3 = vpermilps_avx(local_820._0_16_,0xff);
                fVar200 = fVar200 - auVar3._0_4_;
                auVar4 = vshufps_avx(local_920._0_16_,local_920._0_16_,0xff);
                auVar3 = vfmsub213ss_fma(local_940._0_16_,ZEXT416((uint)fVar186),auVar4);
                auVar176._0_8_ = auVar5._0_8_ ^ 0x8000000080000000;
                auVar176._8_4_ = auVar5._8_4_ ^ 0x80000000;
                auVar176._12_4_ = auVar5._12_4_ ^ 0x80000000;
                auVar193._0_8_ = auVar3._0_8_ ^ 0x8000000080000000;
                auVar193._8_4_ = auVar3._8_4_ ^ 0x80000000;
                auVar193._12_4_ = auVar3._12_4_ ^ 0x80000000;
                auVar107 = ZEXT416((uint)(auVar107._0_4_ * fVar186));
                auVar3 = vfmsub231ss_fma(ZEXT416((uint)(auVar5._0_4_ * auVar3._0_4_)),
                                         local_a60._0_16_,auVar107);
                auVar107 = vinsertps_avx(auVar193,auVar107,0x1c);
                uVar207 = auVar3._0_4_;
                auVar194._4_4_ = uVar207;
                auVar194._0_4_ = uVar207;
                auVar194._8_4_ = uVar207;
                auVar194._12_4_ = uVar207;
                auVar107 = vdivps_avx(auVar107,auVar194);
                auVar3 = vinsertps_avx(local_a60._0_16_,auVar176,0x10);
                auVar3 = vdivps_avx(auVar3,auVar194);
                fVar186 = local_a40._0_4_;
                auVar150._0_4_ = fVar186 * auVar107._0_4_ + fVar200 * auVar3._0_4_;
                auVar150._4_4_ = fVar186 * auVar107._4_4_ + fVar200 * auVar3._4_4_;
                auVar150._8_4_ = fVar186 * auVar107._8_4_ + fVar200 * auVar3._8_4_;
                auVar150._12_4_ = fVar186 * auVar107._12_4_ + fVar200 * auVar3._12_4_;
                auVar3 = vsubps_avx(auVar237,auVar150);
                auVar241 = ZEXT1664(auVar3);
                auVar107 = vandps_avx(local_a40._0_16_,local_860._0_16_);
                if (auVar107._0_4_ < auVar253._0_4_) {
                  auVar102 = vfmadd231ss_fma(ZEXT416((uint)(auVar102._0_4_ + auVar253._0_4_)),
                                             local_700._0_16_,ZEXT416(0x36000000));
                  auVar107 = vandps_avx(ZEXT416((uint)fVar200),local_860._0_16_);
                  if (auVar107._0_4_ < auVar102._0_4_) {
                    fVar186 = auVar3._0_4_ + (float)local_7c0._0_4_;
                    if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar186) {
                      fVar200 = (ray->super_RayK<1>).tfar;
                      auVar253 = ZEXT464((uint)fVar200);
                      if (fVar186 <= fVar200) {
                        auVar107 = vmovshdup_avx(auVar3);
                        fVar201 = auVar107._0_4_;
                        if ((0.0 <= fVar201) && (fVar201 <= 1.0)) {
                          auVar107 = vrsqrtss_avx(local_a80._0_16_,local_a80._0_16_);
                          fVar202 = auVar107._0_4_;
                          pGVar10 = (context->scene->geometries).items[uVar90].ptr;
                          if ((pGVar10->mask & (ray->super_RayK<1>).mask) != 0) {
                            fVar202 = fVar202 * 1.5 +
                                      local_a80._0_4_ * -0.5 * fVar202 * fVar202 * fVar202;
                            auVar177._0_4_ = fVar202 * (float)local_9e0._0_4_;
                            auVar177._4_4_ = fVar202 * (float)local_9e0._4_4_;
                            auVar177._8_4_ = fVar202 * fStack_9d8;
                            auVar177._12_4_ = fVar202 * fStack_9d4;
                            auVar237 = vfmadd213ps_fma(auVar4,auVar177,local_920._0_16_);
                            auVar107 = vshufps_avx(auVar177,auVar177,0xc9);
                            auVar102 = vshufps_avx(local_920._0_16_,local_920._0_16_,0xc9);
                            auVar178._0_4_ = auVar177._0_4_ * auVar102._0_4_;
                            auVar178._4_4_ = auVar177._4_4_ * auVar102._4_4_;
                            auVar178._8_4_ = auVar177._8_4_ * auVar102._8_4_;
                            auVar178._12_4_ = auVar177._12_4_ * auVar102._12_4_;
                            auVar4 = vfmsub231ps_fma(auVar178,local_920._0_16_,auVar107);
                            auVar107 = vshufps_avx(auVar4,auVar4,0xc9);
                            auVar102 = vshufps_avx(auVar237,auVar237,0xc9);
                            auVar4 = vshufps_avx(auVar4,auVar4,0xd2);
                            auVar110._0_4_ = auVar237._0_4_ * auVar4._0_4_;
                            auVar110._4_4_ = auVar237._4_4_ * auVar4._4_4_;
                            auVar110._8_4_ = auVar237._8_4_ * auVar4._8_4_;
                            auVar110._12_4_ = auVar237._12_4_ * auVar4._12_4_;
                            auVar107 = vfmsub231ps_fma(auVar110,auVar107,auVar102);
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              (ray->super_RayK<1>).tfar = fVar186;
                              auVar102 = vshufps_avx(auVar107,auVar107,0xe9);
                              uVar98 = vmovlps_avx(auVar102);
                              *(undefined8 *)&(ray->Ng).field_0 = uVar98;
                              (ray->Ng).field_0.field_0.z = auVar107._0_4_;
                              ray->u = fVar201;
                              ray->v = 0.0;
                              ray->primID = local_960._0_4_;
                              ray->geomID = uVar90;
                              ray->instID[0] = context->user->instID[0];
                              ray->instPrimID[0] = context->user->instPrimID[0];
                            }
                            else {
                              auVar102 = vshufps_avx(auVar107,auVar107,0xe9);
                              local_9b0 = vmovlps_avx(auVar102);
                              local_9a8 = auVar107._0_4_;
                              local_9a4 = fVar201;
                              local_9a0 = 0;
                              local_99c = local_960._0_4_;
                              local_998 = uVar90;
                              local_994 = context->user->instID[0];
                              local_990 = context->user->instPrimID[0];
                              (ray->super_RayK<1>).tfar = fVar186;
                              local_a84 = -1;
                              local_ab8.valid = &local_a84;
                              local_ab8.geometryUserPtr = pGVar10->userPtr;
                              local_ab8.context = context->user;
                              local_ab8.hit = (RTCHitN *)&local_9b0;
                              local_ab8.N = 1;
                              local_ab8.ray = (RTCRayN *)ray;
                              if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01788530:
                                p_Var11 = context->args->filter;
                                if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                  auVar223 = ZEXT1664(auVar223._0_16_);
                                  auVar241 = ZEXT1664(auVar241._0_16_);
                                  auVar250 = ZEXT1664(auVar250._0_16_);
                                  auVar253 = ZEXT1664(auVar253._0_16_);
                                  auVar260 = ZEXT1664(auVar260._0_16_);
                                  (*p_Var11)(&local_ab8);
                                  if (*local_ab8.valid == 0) goto LAB_017885b9;
                                }
                                (((Vec3f *)((long)local_ab8.ray + 0x30))->field_0).components[0] =
                                     *(float *)local_ab8.hit;
                                (((Vec3f *)((long)local_ab8.ray + 0x30))->field_0).field_0.y =
                                     *(float *)(local_ab8.hit + 4);
                                (((Vec3f *)((long)local_ab8.ray + 0x30))->field_0).field_0.z =
                                     *(float *)(local_ab8.hit + 8);
                                *(float *)((long)local_ab8.ray + 0x3c) =
                                     *(float *)(local_ab8.hit + 0xc);
                                *(float *)((long)local_ab8.ray + 0x40) =
                                     *(float *)(local_ab8.hit + 0x10);
                                *(float *)((long)local_ab8.ray + 0x44) =
                                     *(float *)(local_ab8.hit + 0x14);
                                *(float *)((long)local_ab8.ray + 0x48) =
                                     *(float *)(local_ab8.hit + 0x18);
                                *(float *)((long)local_ab8.ray + 0x4c) =
                                     *(float *)(local_ab8.hit + 0x1c);
                                *(float *)((long)local_ab8.ray + 0x50) =
                                     *(float *)(local_ab8.hit + 0x20);
                              }
                              else {
                                auVar223 = ZEXT1664(auVar223._0_16_);
                                auVar241 = ZEXT1664(auVar3);
                                auVar250 = ZEXT1664(local_920._0_16_);
                                auVar253 = ZEXT464((uint)fVar200);
                                auVar260 = ZEXT1664(auVar260._0_16_);
                                (*pGVar10->intersectionFilterN)(&local_ab8);
                                if (*local_ab8.valid != 0) goto LAB_01788530;
LAB_017885b9:
                                (ray->super_RayK<1>).tfar = fVar200;
                              }
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar91 = lVar91 + -1;
              } while (lVar91 != 0);
              auVar113 = local_6c0;
              fVar186 = (ray->super_RayK<1>).tfar;
              auVar116._4_4_ = fVar186;
              auVar116._0_4_ = fVar186;
              auVar116._8_4_ = fVar186;
              auVar116._12_4_ = fVar186;
              auVar116._16_4_ = fVar186;
              auVar116._20_4_ = fVar186;
              auVar116._24_4_ = fVar186;
              auVar116._28_4_ = fVar186;
              auVar112 = vcmpps_avx(_local_720,auVar116,2);
              local_6c0 = vandps_avx(auVar112,local_6c0);
              auVar113 = auVar113 & auVar112;
            } while ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar113 >> 0x7f,0) != '\0') ||
                       (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar113 >> 0xbf,0) != '\0') ||
                     (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar113[0x1f] < '\0');
            uVar207 = local_960._0_4_;
          }
          auVar159._0_4_ = (float)local_7e0._0_4_ + local_4e0._0_4_;
          auVar159._4_4_ = (float)local_7e0._4_4_ + local_4e0._4_4_;
          auVar159._8_4_ = fStack_7d8 + local_4e0._8_4_;
          auVar159._12_4_ = fStack_7d4 + local_4e0._12_4_;
          auVar159._16_4_ = fStack_7d0 + local_4e0._16_4_;
          auVar159._20_4_ = fStack_7cc + local_4e0._20_4_;
          auVar159._24_4_ = fStack_7c8 + local_4e0._24_4_;
          auVar159._28_4_ = fStack_7c4 + local_4e0._28_4_;
          auVar113 = vcmpps_avx(auVar159,auVar116,2);
          auVar112 = vandps_avx(local_5c0,local_5a0);
          auVar112 = vandps_avx(auVar113,auVar112);
          auVar185._0_4_ = (float)local_7e0._0_4_ + local_520._0_4_;
          auVar185._4_4_ = (float)local_7e0._4_4_ + local_520._4_4_;
          auVar185._8_4_ = fStack_7d8 + local_520._8_4_;
          auVar185._12_4_ = fStack_7d4 + local_520._12_4_;
          auVar185._16_4_ = fStack_7d0 + local_520._16_4_;
          auVar185._20_4_ = fStack_7cc + local_520._20_4_;
          auVar185._24_4_ = fStack_7c8 + local_520._24_4_;
          auVar185._28_4_ = fStack_7c4 + local_520._28_4_;
          auVar13 = vcmpps_avx(auVar185,auVar116,2);
          auVar113 = vandps_avx(_local_740,_local_8e0);
          auVar113 = vandps_avx(auVar13,auVar113);
          auVar113 = vorps_avx(auVar112,auVar113);
          if ((((((((auVar113 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar113 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar113 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar113 >> 0x7f,0) != '\0') ||
                (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar113 >> 0xbf,0) != '\0') ||
              (auVar113 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar113[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar95 * 0x60) = auVar113;
            auVar112 = vblendvps_avx(local_520,local_4e0,auVar112);
            *(undefined1 (*) [32])(auStack_160 + uVar95 * 0x60) = auVar112;
            uVar98 = vmovlps_avx(local_530);
            (&uStack_140)[uVar95 * 0xc] = uVar98;
            aiStack_138[uVar95 * 0x18] = local_aec + 1;
            iVar94 = iVar94 + 1;
          }
        }
      }
    }
    fVar186 = (ray->super_RayK<1>).tfar;
    auVar119._4_4_ = fVar186;
    auVar119._0_4_ = fVar186;
    auVar119._8_4_ = fVar186;
    auVar119._12_4_ = fVar186;
    auVar119._16_4_ = fVar186;
    auVar119._20_4_ = fVar186;
    auVar119._24_4_ = fVar186;
    auVar119._28_4_ = fVar186;
    if (iVar94 == 0) break;
    uVar88 = -iVar94;
    pauVar87 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar94 - 1) * 0x60);
    fVar186 = (float)local_7e0._0_4_;
    fVar200 = (float)local_7e0._4_4_;
    fVar201 = fStack_7d8;
    fVar202 = fStack_7d4;
    fVar268 = fStack_7d0;
    fVar271 = fStack_7cc;
    fVar272 = fStack_7c8;
    fVar203 = fStack_7c4;
    while( true ) {
      auVar112 = pauVar87[1];
      auVar138._0_4_ = fVar186 + auVar112._0_4_;
      auVar138._4_4_ = fVar200 + auVar112._4_4_;
      auVar138._8_4_ = fVar201 + auVar112._8_4_;
      auVar138._12_4_ = fVar202 + auVar112._12_4_;
      auVar138._16_4_ = fVar268 + auVar112._16_4_;
      auVar138._20_4_ = fVar271 + auVar112._20_4_;
      auVar138._24_4_ = fVar272 + auVar112._24_4_;
      auVar138._28_4_ = fVar203 + auVar112._28_4_;
      auVar13 = vcmpps_avx(auVar138,auVar119,2);
      auVar113 = vandps_avx(auVar13,*pauVar87);
      local_4e0 = auVar113;
      auVar13 = *pauVar87 & auVar13;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0x7f,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0xbf,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar13[0x1f] < '\0') break;
      pauVar87 = pauVar87 + -3;
      uVar88 = uVar88 + 1;
      fVar186 = (float)local_7e0._0_4_;
      fVar200 = (float)local_7e0._4_4_;
      fVar201 = fStack_7d8;
      fVar202 = fStack_7d4;
      fVar268 = fStack_7d0;
      fVar271 = fStack_7cc;
      fVar272 = fStack_7c8;
      fVar203 = fStack_7c4;
      if (uVar88 == 0) goto LAB_01788872;
    }
    auVar120._8_4_ = 0x7f800000;
    auVar120._0_8_ = 0x7f8000007f800000;
    auVar120._12_4_ = 0x7f800000;
    auVar120._16_4_ = 0x7f800000;
    auVar120._20_4_ = 0x7f800000;
    auVar120._24_4_ = 0x7f800000;
    auVar120._28_4_ = 0x7f800000;
    auVar112 = vblendvps_avx(auVar120,auVar112,auVar113);
    auVar13 = vshufps_avx(auVar112,auVar112,0xb1);
    auVar13 = vminps_avx(auVar112,auVar13);
    auVar221 = vshufpd_avx(auVar13,auVar13,5);
    auVar13 = vminps_avx(auVar13,auVar221);
    auVar221 = vpermpd_avx2(auVar13,0x4e);
    auVar13 = vminps_avx(auVar13,auVar221);
    auVar112 = vcmpps_avx(auVar112,auVar13,0);
    auVar13 = auVar113 & auVar112;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar113 = vandps_avx(auVar112,auVar113);
    }
    uVar20 = *(ulong *)pauVar87[2];
    auVar111._8_8_ = 0;
    auVar111._0_8_ = uVar20;
    uVar89 = vmovmskps_avx(auVar113);
    iVar94 = 0;
    for (; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x80000000) {
      iVar94 = iVar94 + 1;
    }
    *(undefined4 *)(local_4e0 + (uint)(iVar94 << 2)) = 0;
    uVar89 = ~uVar88;
    if ((((((((local_4e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_4e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_4e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_4e0 >> 0x7f,0) != '\0') ||
          (local_4e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_4e0 >> 0xbf,0) != '\0') ||
        (local_4e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_4e0[0x1f] < '\0') {
      uVar89 = -uVar88;
    }
    uVar95 = (ulong)uVar89;
    local_aec = *(int *)(pauVar87[2] + 8);
    *pauVar87 = local_4e0;
    uVar97 = (undefined4)uVar20;
    auVar139._4_4_ = uVar97;
    auVar139._0_4_ = uVar97;
    auVar139._8_4_ = uVar97;
    auVar139._12_4_ = uVar97;
    auVar139._16_4_ = uVar97;
    auVar139._20_4_ = uVar97;
    auVar139._24_4_ = uVar97;
    auVar139._28_4_ = uVar97;
    auVar107 = vmovshdup_avx(auVar111);
    auVar107 = vsubps_avx(auVar107,auVar111);
    auVar121._0_4_ = auVar107._0_4_;
    auVar121._4_4_ = auVar121._0_4_;
    auVar121._8_4_ = auVar121._0_4_;
    auVar121._12_4_ = auVar121._0_4_;
    auVar121._16_4_ = auVar121._0_4_;
    auVar121._20_4_ = auVar121._0_4_;
    auVar121._24_4_ = auVar121._0_4_;
    auVar121._28_4_ = auVar121._0_4_;
    auVar107 = vfmadd132ps_fma(auVar121,auVar139,_DAT_01faff20);
    local_520 = ZEXT1632(auVar107);
    local_530._8_8_ = 0;
    local_530._0_8_ = *(ulong *)(local_520 + (uint)(iVar94 << 2));
  } while( true );
LAB_01788872:
  auVar112 = vcmpps_avx(local_2e0,auVar119,2);
  uVar90 = vmovmskps_avx(auVar112);
  uVar90 = (uint)uVar93 & uVar90;
  if (uVar90 == 0) {
    return;
  }
  goto LAB_01786260;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }